

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  long lVar73;
  uint uVar74;
  ulong uVar75;
  undefined4 uVar76;
  undefined8 unaff_R14;
  ulong uVar77;
  bool bVar78;
  float fVar79;
  float fVar118;
  float fVar120;
  vint4 bi_2;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar81;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar100 [32];
  float fVar80;
  undefined1 auVar101 [32];
  float fVar119;
  float fVar121;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar86 [16];
  undefined1 auVar114 [32];
  undefined1 auVar93 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar127 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  vint4 ai_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar183;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar184;
  float fVar200;
  float fVar201;
  vint4 ai;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar202;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  vint4 bi;
  undefined1 auVar211 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  vint4 ai_1;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar229 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar237;
  undefined1 auVar233 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar228 [28];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar235;
  float fVar236;
  undefined1 auVar234 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar242;
  float fVar252;
  float fVar253;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar251 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar267;
  float fVar268;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_be8;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [16];
  undefined1 auStack_a70 [16];
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0;
  undefined4 uStack_9bc;
  undefined4 uStack_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  Primitive *local_910;
  Primitive *local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  uint local_770;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  RTCHitN local_760 [16];
  undefined1 auStack_750 [16];
  undefined4 local_740;
  undefined4 uStack_73c;
  undefined4 uStack_738;
  undefined4 uStack_734;
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint uStack_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar230 [32];
  undefined1 auVar266 [64];
  undefined1 auVar271 [64];
  undefined1 auVar274 [64];
  
  PVar1 = prim[1];
  uVar77 = (ulong)(byte)PVar1;
  local_910 = prim + uVar77 * 0x19 + 0x16;
  fVar79 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  auVar82._0_4_ = fVar79 * auVar5._0_4_;
  auVar82._4_4_ = fVar79 * auVar5._4_4_;
  auVar82._8_4_ = fVar79 * auVar5._8_4_;
  auVar82._12_4_ = fVar79 * auVar5._12_4_;
  auVar203._0_4_ = fVar79 * auVar6._0_4_;
  auVar203._4_4_ = fVar79 * auVar6._4_4_;
  auVar203._8_4_ = fVar79 * auVar6._8_4_;
  auVar203._12_4_ = fVar79 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xc + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xd + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x12 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x13 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x14 + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar278._4_4_ = auVar203._0_4_;
  auVar278._0_4_ = auVar203._0_4_;
  auVar278._8_4_ = auVar203._0_4_;
  auVar278._12_4_ = auVar203._0_4_;
  auVar88 = vshufps_avx(auVar203,auVar203,0x55);
  auVar83 = vshufps_avx(auVar203,auVar203,0xaa);
  fVar79 = auVar83._0_4_;
  auVar260._0_4_ = fVar79 * auVar8._0_4_;
  fVar118 = auVar83._4_4_;
  auVar260._4_4_ = fVar118 * auVar8._4_4_;
  fVar184 = auVar83._8_4_;
  auVar260._8_4_ = fVar184 * auVar8._8_4_;
  fVar200 = auVar83._12_4_;
  auVar260._12_4_ = fVar200 * auVar8._12_4_;
  auVar243._0_4_ = auVar10._0_4_ * fVar79;
  auVar243._4_4_ = auVar10._4_4_ * fVar118;
  auVar243._8_4_ = auVar10._8_4_ * fVar184;
  auVar243._12_4_ = auVar10._12_4_ * fVar200;
  auVar224._0_4_ = auVar127._0_4_ * fVar79;
  auVar224._4_4_ = auVar127._4_4_ * fVar118;
  auVar224._8_4_ = auVar127._8_4_ * fVar184;
  auVar224._12_4_ = auVar127._12_4_ * fVar200;
  auVar83 = vfmadd231ps_fma(auVar260,auVar88,auVar6);
  auVar126 = vfmadd231ps_fma(auVar243,auVar88,auVar92);
  auVar88 = vfmadd231ps_fma(auVar224,auVar84,auVar88);
  auVar146 = vfmadd231ps_fma(auVar83,auVar278,auVar5);
  auVar126 = vfmadd231ps_fma(auVar126,auVar278,auVar9);
  auVar186 = vfmadd231ps_fma(auVar88,auVar85,auVar278);
  auVar279._4_4_ = auVar82._0_4_;
  auVar279._0_4_ = auVar82._0_4_;
  auVar279._8_4_ = auVar82._0_4_;
  auVar279._12_4_ = auVar82._0_4_;
  auVar88 = vshufps_avx(auVar82,auVar82,0x55);
  auVar83 = vshufps_avx(auVar82,auVar82,0xaa);
  fVar79 = auVar83._0_4_;
  auVar204._0_4_ = fVar79 * auVar8._0_4_;
  fVar118 = auVar83._4_4_;
  auVar204._4_4_ = fVar118 * auVar8._4_4_;
  fVar184 = auVar83._8_4_;
  auVar204._8_4_ = fVar184 * auVar8._8_4_;
  fVar200 = auVar83._12_4_;
  auVar204._12_4_ = fVar200 * auVar8._12_4_;
  auVar125._0_4_ = auVar10._0_4_ * fVar79;
  auVar125._4_4_ = auVar10._4_4_ * fVar118;
  auVar125._8_4_ = auVar10._8_4_ * fVar184;
  auVar125._12_4_ = auVar10._12_4_ * fVar200;
  auVar83._0_4_ = auVar127._0_4_ * fVar79;
  auVar83._4_4_ = auVar127._4_4_ * fVar118;
  auVar83._8_4_ = auVar127._8_4_ * fVar184;
  auVar83._12_4_ = auVar127._12_4_ * fVar200;
  auVar6 = vfmadd231ps_fma(auVar204,auVar88,auVar6);
  auVar8 = vfmadd231ps_fma(auVar125,auVar88,auVar92);
  auVar92 = vfmadd231ps_fma(auVar83,auVar88,auVar84);
  auVar10 = vfmadd231ps_fma(auVar6,auVar279,auVar5);
  auVar84 = vfmadd231ps_fma(auVar8,auVar279,auVar9);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar127 = vfmadd231ps_fma(auVar92,auVar279,auVar85);
  auVar5 = vandps_avx(auVar146,auVar238);
  auVar185._8_4_ = 0x219392ef;
  auVar185._0_8_ = 0x219392ef219392ef;
  auVar185._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar185,1);
  auVar6 = vblendvps_avx(auVar146,auVar185,auVar5);
  auVar5 = vandps_avx(auVar126,auVar238);
  auVar5 = vcmpps_avx(auVar5,auVar185,1);
  auVar8 = vblendvps_avx(auVar126,auVar185,auVar5);
  auVar5 = vandps_avx(auVar238,auVar186);
  auVar5 = vcmpps_avx(auVar5,auVar185,1);
  auVar5 = vblendvps_avx(auVar186,auVar185,auVar5);
  auVar9 = vrcpps_avx(auVar6);
  auVar225._8_4_ = 0x3f800000;
  auVar225._0_8_ = 0x3f8000003f800000;
  auVar225._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar9,auVar225);
  auVar9 = vfmadd132ps_fma(auVar6,auVar9,auVar9);
  auVar6 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar6,auVar225);
  auVar92 = vfmadd132ps_fma(auVar8,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar225);
  auVar85 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar77 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar8 = vsubps_avx(auVar5,auVar10);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar77 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar186._0_4_ = auVar9._0_4_ * auVar8._0_4_;
  auVar186._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar186._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar186._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar205._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar205._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar205._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar205._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar77 * 0xe + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vsubps_avx(auVar5,auVar84);
  auVar126._1_3_ = 0;
  auVar126[0] = PVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar216._0_4_ = auVar92._0_4_ * auVar6._0_4_;
  auVar216._4_4_ = auVar92._4_4_ * auVar6._4_4_;
  auVar216._8_4_ = auVar92._8_4_ * auVar6._8_4_;
  auVar216._12_4_ = auVar92._12_4_ * auVar6._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar84);
  auVar88._0_4_ = auVar92._0_4_ * auVar5._0_4_;
  auVar88._4_4_ = auVar92._4_4_ * auVar5._4_4_;
  auVar88._8_4_ = auVar92._8_4_ * auVar5._8_4_;
  auVar88._12_4_ = auVar92._12_4_ * auVar5._12_4_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar77 * 0x15 + 6);
  auVar5 = vpmovsxwd_avx(auVar92);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar127);
  auVar146._0_4_ = auVar85._0_4_ * auVar5._0_4_;
  auVar146._4_4_ = auVar85._4_4_ * auVar5._4_4_;
  auVar146._8_4_ = auVar85._8_4_ * auVar5._8_4_;
  auVar146._12_4_ = auVar85._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar77 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar127);
  auVar84._0_4_ = auVar85._0_4_ * auVar5._0_4_;
  auVar84._4_4_ = auVar85._4_4_ * auVar5._4_4_;
  auVar84._8_4_ = auVar85._8_4_ * auVar5._8_4_;
  auVar84._12_4_ = auVar85._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar186,auVar205);
  auVar6 = vpminsd_avx(auVar216,auVar88);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar146,auVar84);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar244._4_4_ = uVar76;
  auVar244._0_4_ = uVar76;
  auVar244._8_4_ = uVar76;
  auVar244._12_4_ = uVar76;
  auVar6 = vmaxps_avx(auVar6,auVar244);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_600._0_4_ = auVar5._0_4_ * 0.99999964;
  local_600._4_4_ = auVar5._4_4_ * 0.99999964;
  local_600._8_4_ = auVar5._8_4_ * 0.99999964;
  local_600._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar186,auVar205);
  auVar6 = vpmaxsd_avx(auVar216,auVar88);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar146,auVar84);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar127._4_4_ = uVar76;
  auVar127._0_4_ = uVar76;
  auVar127._8_4_ = uVar76;
  auVar127._12_4_ = uVar76;
  auVar6 = vminps_avx(auVar6,auVar127);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar85._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar85._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar85._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar85._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar126[4] = PVar1;
  auVar126._5_3_ = 0;
  auVar126[8] = PVar1;
  auVar126._9_3_ = 0;
  auVar126[0xc] = PVar1;
  auVar126._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar126,_DAT_01f4ad30);
  auVar5 = vcmpps_avx(local_600,auVar85,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  auVar132._16_16_ = mm_lookupmask_ps._240_16_;
  auVar132._0_16_ = mm_lookupmask_ps._240_16_;
  uVar76 = vmovmskps_avx(auVar5);
  uVar77 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar76);
  local_5c0 = vblendps_avx(auVar132,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_908 = prim;
LAB_01114fd5:
  if (uVar77 == 0) {
    return;
  }
  lVar73 = 0;
  for (uVar72 = uVar77; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    lVar73 = lVar73 + 1;
  }
  uVar77 = uVar77 - 1 & uVar77;
  local_900._0_4_ = *(undefined4 *)(local_908 + lVar73 * 4 + 6);
  uVar72 = (ulong)(uint)((int)lVar73 << 6);
  auVar5 = *(undefined1 (*) [16])(local_910 + uVar72);
  if (uVar77 != 0) {
    uVar75 = uVar77 - 1 & uVar77;
    for (uVar14 = uVar77; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
    }
    if (uVar75 != 0) {
      for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = *(undefined1 (*) [16])(local_910 + uVar72 + 0x10);
  auVar8 = *(undefined1 (*) [16])(local_910 + uVar72 + 0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar10 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar261._4_4_ = uVar76;
  auVar261._0_4_ = uVar76;
  auVar261._8_4_ = uVar76;
  auVar261._12_4_ = uVar76;
  fStack_690 = (float)uVar76;
  _local_6a0 = auVar261;
  fStack_68c = (float)uVar76;
  fStack_688 = (float)uVar76;
  register0x0000149c = uVar76;
  auVar266 = ZEXT3264(_local_6a0);
  auVar9 = *(undefined1 (*) [16])(local_910 + uVar72 + 0x30);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar269._4_4_ = uVar76;
  auVar269._0_4_ = uVar76;
  auVar269._8_4_ = uVar76;
  auVar269._12_4_ = uVar76;
  fStack_830 = (float)uVar76;
  _local_840 = auVar269;
  fStack_82c = (float)uVar76;
  fStack_828 = (float)uVar76;
  uStack_824 = uVar76;
  auVar271 = ZEXT3264(_local_840);
  auVar92 = vunpcklps_avx(auVar261,auVar269);
  fVar79 = *(float *)(ray + k * 4 + 0x60);
  auVar272._4_4_ = fVar79;
  auVar272._0_4_ = fVar79;
  auVar272._8_4_ = fVar79;
  auVar272._12_4_ = fVar79;
  fStack_810 = fVar79;
  _local_820 = auVar272;
  fStack_80c = fVar79;
  fStack_808 = fVar79;
  uStack_804 = fVar79;
  auVar274 = ZEXT3264(_local_820);
  local_990 = vinsertps_avx(auVar92,auVar272,0x28);
  auVar206._0_4_ = (auVar5._0_4_ + auVar6._0_4_ + auVar8._0_4_ + auVar9._0_4_) * 0.25;
  auVar206._4_4_ = (auVar5._4_4_ + auVar6._4_4_ + auVar8._4_4_ + auVar9._4_4_) * 0.25;
  auVar206._8_4_ = (auVar5._8_4_ + auVar6._8_4_ + auVar8._8_4_ + auVar9._8_4_) * 0.25;
  auVar206._12_4_ = (auVar5._12_4_ + auVar6._12_4_ + auVar8._12_4_ + auVar9._12_4_) * 0.25;
  auVar92 = vsubps_avx(auVar206,auVar10);
  auVar92 = vdpps_avx(auVar92,local_990,0x7f);
  local_9a0 = vdpps_avx(local_990,local_990,0x7f);
  auVar251 = ZEXT1664(local_9a0);
  uVar71 = *(uint *)(local_908 + 2);
  auVar85 = vrcpss_avx(local_9a0,local_9a0);
  auVar84 = vfnmadd213ss_fma(auVar85,local_9a0,ZEXT416(0x40000000));
  local_340 = auVar92._0_4_ * auVar85._0_4_ * auVar84._0_4_;
  auVar215 = ZEXT464((uint)local_340);
  auVar217._4_4_ = local_340;
  auVar217._0_4_ = local_340;
  auVar217._8_4_ = local_340;
  auVar217._12_4_ = local_340;
  fStack_970 = local_340;
  _local_980 = auVar217;
  fStack_96c = local_340;
  fStack_968 = local_340;
  fStack_964 = local_340;
  auVar92 = vfmadd231ps_fma(auVar10,local_990,auVar217);
  auVar92 = vblendps_avx(auVar92,_DAT_01f45a50,8);
  auVar10 = vsubps_avx(auVar5,auVar92);
  auVar8 = vsubps_avx(auVar8,auVar92);
  auVar85 = vsubps_avx(auVar6,auVar92);
  auVar9 = vsubps_avx(auVar9,auVar92);
  auVar5 = vmovshdup_avx(auVar10);
  local_460 = auVar5._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar5 = vshufps_avx(auVar10,auVar10,0xaa);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vshufps_avx(auVar10,auVar10,0xff);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vmovshdup_avx(auVar85);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar5 = vshufps_avx(auVar85,auVar85,0xaa);
  local_480 = auVar5._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar5 = vshufps_avx(auVar85,auVar85,0xff);
  local_240 = auVar5._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar5 = vmovshdup_avx(auVar8);
  local_4a0 = auVar5._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_4c0 = auVar5._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_4e0 = auVar5._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar5 = vmovshdup_avx(auVar9);
  local_500 = auVar5._0_8_;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  local_520 = auVar5._0_8_;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_540 = auVar5._0_8_;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar79 * fVar79)),_local_840,_local_840);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_6a0,_local_6a0);
  uVar76 = auVar5._0_4_;
  local_260._4_4_ = uVar76;
  local_260._0_4_ = uVar76;
  local_260._8_4_ = uVar76;
  local_260._12_4_ = uVar76;
  local_260._16_4_ = uVar76;
  local_260._20_4_ = uVar76;
  local_260._24_4_ = uVar76;
  local_260._28_4_ = uVar76;
  auVar234 = ZEXT3264(local_260);
  fVar79 = *(float *)(ray + k * 4 + 0x30);
  local_930 = ZEXT416((uint)local_340);
  local_340 = fVar79 - local_340;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  uVar72 = 0;
  local_be8 = 1;
  local_560 = auVar10._0_4_;
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  local_280 = auVar85._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  local_580 = auVar8._0_4_;
  uStack_57c = local_580;
  uStack_578 = local_580;
  uStack_574 = local_580;
  uStack_570 = local_580;
  uStack_56c = local_580;
  uStack_568 = local_580;
  uStack_564 = local_580;
  fVar118 = auVar9._0_4_;
  local_8a0._8_4_ = 0x7fffffff;
  local_8a0._0_8_ = 0x7fffffff7fffffff;
  local_8a0._12_4_ = 0x7fffffff;
  local_8a0._16_4_ = 0x7fffffff;
  local_8a0._20_4_ = 0x7fffffff;
  local_8a0._24_4_ = 0x7fffffff;
  local_8a0._28_4_ = 0x7fffffff;
  local_5e0 = vandps_avx(local_260,local_8a0);
  auVar5 = vsqrtss_avx(local_9a0,local_9a0);
  auVar6 = vsqrtss_avx(local_9a0,local_9a0);
  local_5f0 = ZEXT816(0x3f80000000000000);
  local_5a0 = fVar118;
  fStack_59c = fVar118;
  fStack_598 = fVar118;
  fStack_594 = fVar118;
  fStack_590 = fVar118;
  fStack_58c = fVar118;
  fStack_588 = fVar118;
  fStack_584 = fVar118;
  local_780 = local_900._0_4_;
  uStack_77c = local_900._0_4_;
  uStack_778 = local_900._0_4_;
  uStack_774 = local_900._0_4_;
  local_770 = uVar71;
  uStack_76c = uVar71;
  uStack_768 = uVar71;
  uStack_764 = uVar71;
  do {
    auVar92 = vmovshdup_avx(local_5f0);
    auVar92 = vsubps_avx(auVar92,local_5f0);
    auVar100._0_4_ = auVar92._0_4_;
    fVar162 = auVar100._0_4_ * 0.04761905;
    uVar76 = local_5f0._0_4_;
    auVar218._4_4_ = uVar76;
    auVar218._0_4_ = uVar76;
    auVar218._8_4_ = uVar76;
    auVar218._12_4_ = uVar76;
    auVar218._16_4_ = uVar76;
    auVar218._20_4_ = uVar76;
    auVar218._24_4_ = uVar76;
    auVar218._28_4_ = uVar76;
    auVar100._4_4_ = auVar100._0_4_;
    auVar100._8_4_ = auVar100._0_4_;
    auVar100._12_4_ = auVar100._0_4_;
    auVar100._16_4_ = auVar100._0_4_;
    auVar100._20_4_ = auVar100._0_4_;
    auVar100._24_4_ = auVar100._0_4_;
    auVar100._28_4_ = auVar100._0_4_;
    auVar92 = vfmadd231ps_fma(auVar218,auVar100,_DAT_01f7b040);
    auVar101._8_4_ = 0x3f800000;
    auVar101._0_8_ = 0x3f8000003f800000;
    auVar101._12_4_ = 0x3f800000;
    auVar101._16_4_ = 0x3f800000;
    auVar101._20_4_ = 0x3f800000;
    auVar101._24_4_ = 0x3f800000;
    auVar101._28_4_ = 0x3f800000;
    auVar132 = vsubps_avx(auVar101,ZEXT1632(auVar92));
    fVar184 = auVar132._0_4_;
    fVar201 = auVar132._4_4_;
    fVar81 = auVar132._8_4_;
    fVar183 = auVar132._12_4_;
    fVar235 = auVar132._16_4_;
    fVar236 = auVar132._20_4_;
    fVar237 = auVar132._24_4_;
    fVar80 = fVar184 * fVar184 * fVar184;
    fVar119 = fVar201 * fVar201 * fVar201;
    fVar120 = fVar81 * fVar81 * fVar81;
    fVar121 = fVar183 * fVar183 * fVar183;
    fVar122 = fVar235 * fVar235 * fVar235;
    fVar123 = fVar236 * fVar236 * fVar236;
    fVar124 = fVar237 * fVar237 * fVar237;
    fVar200 = auVar92._0_4_;
    fVar202 = auVar92._4_4_;
    fVar254 = auVar92._8_4_;
    fVar256 = auVar92._12_4_;
    fVar142 = fVar200 * fVar200 * fVar200;
    fVar159 = fVar202 * fVar202 * fVar202;
    fVar160 = fVar254 * fVar254 * fVar254;
    fVar161 = fVar256 * fVar256 * fVar256;
    fVar242 = fVar184 * fVar200;
    fVar252 = fVar201 * fVar202;
    fVar253 = fVar81 * fVar254;
    fVar255 = fVar183 * fVar256;
    fVar257 = fVar235 * 0.0;
    fVar258 = fVar236 * 0.0;
    fVar259 = fVar237 * 0.0;
    fVar267 = auVar266._28_4_ + auVar274._28_4_;
    fVar268 = fVar267 + 1.0;
    fVar163 = auVar271._28_4_;
    auVar113._4_4_ = fVar119 * 0.16666667;
    auVar113._0_4_ = fVar80 * 0.16666667;
    auVar113._8_4_ = fVar120 * 0.16666667;
    auVar113._12_4_ = fVar121 * 0.16666667;
    auVar113._16_4_ = fVar122 * 0.16666667;
    auVar113._20_4_ = fVar123 * 0.16666667;
    auVar113._24_4_ = fVar124 * 0.16666667;
    auVar113._28_4_ = fVar268;
    auVar7._4_4_ = (fVar201 * fVar252 * 12.0 + fVar252 * fVar202 * 6.0 + fVar159 + fVar119 * 4.0) *
                   0.16666667;
    auVar7._0_4_ = (fVar184 * fVar242 * 12.0 + fVar242 * fVar200 * 6.0 + fVar142 + fVar80 * 4.0) *
                   0.16666667;
    auVar7._8_4_ = (fVar81 * fVar253 * 12.0 + fVar253 * fVar254 * 6.0 + fVar160 + fVar120 * 4.0) *
                   0.16666667;
    auVar7._12_4_ =
         (fVar183 * fVar255 * 12.0 + fVar255 * fVar256 * 6.0 + fVar161 + fVar121 * 4.0) * 0.16666667
    ;
    auVar7._16_4_ =
         (fVar235 * fVar257 * 12.0 + fVar257 * 0.0 * 6.0 + fVar122 * 4.0 + 0.0) * 0.16666667;
    auVar7._20_4_ =
         (fVar236 * fVar258 * 12.0 + fVar258 * 0.0 * 6.0 + fVar123 * 4.0 + 0.0) * 0.16666667;
    auVar7._24_4_ =
         (fVar237 * fVar259 * 12.0 + fVar259 * 0.0 * 6.0 + fVar124 * 4.0 + 0.0) * 0.16666667;
    auVar7._28_4_ = fVar163;
    auVar284._4_4_ =
         (fVar159 * 4.0 + fVar119 + fVar252 * fVar202 * 12.0 + fVar201 * fVar252 * 6.0) * 0.16666667
    ;
    auVar284._0_4_ =
         (fVar142 * 4.0 + fVar80 + fVar242 * fVar200 * 12.0 + fVar184 * fVar242 * 6.0) * 0.16666667;
    auVar284._8_4_ =
         (fVar160 * 4.0 + fVar120 + fVar253 * fVar254 * 12.0 + fVar81 * fVar253 * 6.0) * 0.16666667;
    auVar284._12_4_ =
         (fVar161 * 4.0 + fVar121 + fVar255 * fVar256 * 12.0 + fVar183 * fVar255 * 6.0) * 0.16666667
    ;
    auVar284._16_4_ = (fVar122 + 0.0 + fVar257 * 0.0 * 12.0 + fVar235 * fVar257 * 6.0) * 0.16666667;
    auVar284._20_4_ = (fVar123 + 0.0 + fVar258 * 0.0 * 12.0 + fVar236 * fVar258 * 6.0) * 0.16666667;
    auVar284._24_4_ = (fVar124 + 0.0 + fVar259 * 0.0 * 12.0 + fVar237 * fVar259 * 6.0) * 0.16666667;
    auVar284._28_4_ = auVar274._28_4_;
    fVar142 = fVar142 * 0.16666667;
    fVar159 = fVar159 * 0.16666667;
    fVar160 = fVar160 * 0.16666667;
    fVar161 = fVar161 * 0.16666667;
    auVar110._4_4_ = fStack_59c * fVar159;
    auVar110._0_4_ = local_5a0 * fVar142;
    auVar110._8_4_ = fStack_598 * fVar160;
    auVar110._12_4_ = fStack_594 * fVar161;
    auVar110._16_4_ = fStack_590 * 0.0;
    auVar110._20_4_ = fStack_58c * 0.0;
    auVar110._24_4_ = fStack_588 * 0.0;
    auVar110._28_4_ = 0x3f800000;
    auVar11._4_4_ = fVar159 * local_500._4_4_;
    auVar11._0_4_ = fVar142 * (float)local_500;
    auVar11._8_4_ = fVar160 * (float)uStack_4f8;
    auVar11._12_4_ = fVar161 * uStack_4f8._4_4_;
    auVar11._16_4_ = (float)uStack_4f0 * 0.0;
    auVar11._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar11._24_4_ = (float)uStack_4e8 * 0.0;
    auVar11._28_4_ = 0x3e2aaaab;
    auVar222._4_4_ = fVar159 * local_520._4_4_;
    auVar222._0_4_ = fVar142 * (float)local_520;
    auVar222._8_4_ = fVar160 * (float)uStack_518;
    auVar222._12_4_ = fVar161 * uStack_518._4_4_;
    auVar222._16_4_ = (float)uStack_510 * 0.0;
    auVar222._20_4_ = uStack_510._4_4_ * 0.0;
    auVar222._24_4_ = (float)uStack_508 * 0.0;
    auVar222._28_4_ = fVar267 + 0.0;
    auVar12._4_4_ = fVar159 * local_540._4_4_;
    auVar12._0_4_ = fVar142 * (float)local_540;
    auVar12._8_4_ = fVar160 * (float)uStack_538;
    auVar12._12_4_ = fVar161 * uStack_538._4_4_;
    auVar12._16_4_ = (float)uStack_530 * 0.0;
    auVar12._20_4_ = uStack_530._4_4_ * 0.0;
    auVar12._24_4_ = (float)uStack_528 * 0.0;
    auVar12._28_4_ = fVar268 + fVar163 + auVar215._28_4_;
    auVar102._4_4_ = uStack_57c;
    auVar102._0_4_ = local_580;
    auVar102._8_4_ = uStack_578;
    auVar102._12_4_ = uStack_574;
    auVar102._16_4_ = uStack_570;
    auVar102._20_4_ = uStack_56c;
    auVar102._24_4_ = uStack_568;
    auVar102._28_4_ = uStack_564;
    auVar92 = vfmadd231ps_fma(auVar110,auVar284,auVar102);
    auVar56._8_8_ = uStack_498;
    auVar56._0_8_ = local_4a0;
    auVar56._16_8_ = uStack_490;
    auVar56._24_8_ = uStack_488;
    auVar84 = vfmadd231ps_fma(auVar11,auVar284,auVar56);
    auVar54._8_8_ = uStack_4b8;
    auVar54._0_8_ = local_4c0;
    auVar54._16_8_ = uStack_4b0;
    auVar54._24_8_ = uStack_4a8;
    auVar127 = vfmadd231ps_fma(auVar222,auVar284,auVar54);
    auVar52._8_8_ = uStack_4d8;
    auVar52._0_8_ = local_4e0;
    auVar52._16_8_ = uStack_4d0;
    auVar52._24_8_ = uStack_4c8;
    auVar88 = vfmadd231ps_fma(auVar12,auVar284,auVar52);
    auVar65._4_4_ = uStack_27c;
    auVar65._0_4_ = local_280;
    auVar65._8_4_ = uStack_278;
    auVar65._12_4_ = uStack_274;
    auVar65._16_4_ = uStack_270;
    auVar65._20_4_ = uStack_26c;
    auVar65._24_4_ = uStack_268;
    auVar65._28_4_ = uStack_264;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar7,auVar65);
    auVar67._8_8_ = uStack_218;
    auVar67._0_8_ = local_220;
    auVar67._16_8_ = uStack_210;
    auVar67._24_8_ = uStack_208;
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar7,auVar67);
    auVar58._8_8_ = uStack_478;
    auVar58._0_8_ = local_480;
    auVar58._16_8_ = uStack_470;
    auVar58._24_8_ = uStack_468;
    auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar7,auVar58);
    auVar66._8_8_ = uStack_238;
    auVar66._0_8_ = local_240;
    auVar66._16_8_ = uStack_230;
    auVar66._24_8_ = uStack_228;
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar66,auVar7);
    auVar50._4_4_ = uStack_55c;
    auVar50._0_4_ = local_560;
    auVar50._8_4_ = uStack_558;
    auVar50._12_4_ = uStack_554;
    auVar50._16_4_ = uStack_550;
    auVar50._20_4_ = uStack_54c;
    auVar50._24_4_ = uStack_548;
    auVar50._28_4_ = uStack_544;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar113,auVar50);
    auVar102 = ZEXT1632(auVar92);
    auVar60._8_8_ = uStack_458;
    auVar60._0_8_ = local_460;
    auVar60._16_8_ = uStack_450;
    auVar60._24_8_ = uStack_448;
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar113,auVar60);
    auVar69._8_8_ = uStack_1d8;
    auVar69._0_8_ = local_1e0;
    auVar69._16_8_ = uStack_1d0;
    auVar69._24_8_ = uStack_1c8;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar113,auVar69);
    auVar68._8_8_ = uStack_1f8;
    auVar68._0_8_ = local_200;
    auVar68._16_8_ = uStack_1f0;
    auVar68._24_8_ = uStack_1e8;
    auVar127 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar68,auVar113);
    local_9c0 = -0.0;
    uStack_9bc = 0x80000000;
    uStack_9b8 = 0x80000000;
    uStack_9b4 = 0x80000000;
    uStack_9b0 = 0x80000000;
    uStack_9ac = 0x80000000;
    uStack_9a8 = 0x80000000;
    uStack_9a4 = 0x80000000;
    auVar219._0_4_ = -fVar200 * fVar200;
    auVar219._4_4_ = -fVar202 * fVar202;
    auVar219._8_4_ = -fVar254 * fVar254;
    auVar219._12_4_ = -fVar256 * fVar256;
    auVar219._16_4_ = 0x80000000;
    auVar219._20_4_ = 0x80000000;
    auVar219._24_4_ = 0x80000000;
    auVar219._28_4_ = 0;
    auVar233._4_4_ = fVar252 * 4.0;
    auVar233._0_4_ = fVar242 * 4.0;
    auVar233._8_4_ = fVar253 * 4.0;
    auVar233._12_4_ = fVar255 * 4.0;
    auVar233._16_4_ = fVar257 * 4.0;
    auVar233._20_4_ = fVar258 * 4.0;
    auVar233._24_4_ = fVar259 * 4.0;
    auVar233._28_4_ = auVar251._28_4_;
    auVar113 = vsubps_avx(auVar219,auVar233);
    auVar133._4_4_ = fVar201 * -fVar201 * 0.5;
    auVar133._0_4_ = fVar184 * -fVar184 * 0.5;
    auVar133._8_4_ = fVar81 * -fVar81 * 0.5;
    auVar133._12_4_ = fVar183 * -fVar183 * 0.5;
    auVar133._16_4_ = fVar235 * -fVar235 * 0.5;
    auVar133._20_4_ = fVar236 * -fVar236 * 0.5;
    auVar133._24_4_ = fVar237 * -fVar237 * 0.5;
    auVar133._28_4_ = auVar132._28_4_;
    auVar197._4_4_ = auVar113._4_4_ * 0.5;
    auVar197._0_4_ = auVar113._0_4_ * 0.5;
    auVar197._8_4_ = auVar113._8_4_ * 0.5;
    auVar197._12_4_ = auVar113._12_4_ * 0.5;
    auVar197._16_4_ = auVar113._16_4_ * 0.5;
    auVar197._20_4_ = auVar113._20_4_ * 0.5;
    auVar197._24_4_ = auVar113._24_4_ * 0.5;
    auVar197._28_4_ = auVar113._28_4_;
    auVar211._4_4_ = (fVar252 * 4.0 + fVar201 * fVar201) * 0.5;
    auVar211._0_4_ = (fVar242 * 4.0 + fVar184 * fVar184) * 0.5;
    auVar211._8_4_ = (fVar253 * 4.0 + fVar81 * fVar81) * 0.5;
    auVar211._12_4_ = (fVar255 * 4.0 + fVar183 * fVar183) * 0.5;
    auVar211._16_4_ = (fVar257 * 4.0 + fVar235 * fVar235) * 0.5;
    auVar211._20_4_ = (fVar258 * 4.0 + fVar236 * fVar236) * 0.5;
    auVar211._24_4_ = (fVar259 * 4.0 + fVar237 * fVar237) * 0.5;
    auVar211._28_4_ = auVar251._28_4_ + auVar234._28_4_;
    fVar184 = fVar200 * fVar200 * 0.5;
    fVar200 = fVar202 * fVar202 * 0.5;
    fVar201 = fVar254 * fVar254 * 0.5;
    fVar202 = fVar256 * fVar256 * 0.5;
    auVar273._4_4_ = fVar200 * fStack_59c;
    auVar273._0_4_ = fVar184 * local_5a0;
    auVar273._8_4_ = fVar201 * fStack_598;
    auVar273._12_4_ = fVar202 * fStack_594;
    auVar273._16_4_ = fStack_590 * 0.0;
    auVar273._20_4_ = fStack_58c * 0.0;
    auVar273._24_4_ = fStack_588 * 0.0;
    auVar273._28_4_ = 0x3f000000;
    auVar280._4_4_ = fVar200 * local_500._4_4_;
    auVar280._0_4_ = fVar184 * (float)local_500;
    auVar280._8_4_ = fVar201 * (float)uStack_4f8;
    auVar280._12_4_ = fVar202 * uStack_4f8._4_4_;
    auVar280._16_4_ = (float)uStack_4f0 * 0.0;
    auVar280._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar280._24_4_ = (float)uStack_4e8 * 0.0;
    auVar280._28_4_ = 0x80000000;
    auVar232._4_4_ = fVar200 * local_520._4_4_;
    auVar232._0_4_ = fVar184 * (float)local_520;
    auVar232._8_4_ = fVar201 * (float)uStack_518;
    auVar232._12_4_ = fVar202 * uStack_518._4_4_;
    auVar232._16_4_ = (float)uStack_510 * 0.0;
    auVar232._20_4_ = uStack_510._4_4_ * 0.0;
    auVar232._24_4_ = (float)uStack_508 * 0.0;
    auVar232._28_4_ = fVar163;
    auVar15._4_4_ = fVar200 * local_540._4_4_;
    auVar15._0_4_ = fVar184 * (float)local_540;
    auVar15._8_4_ = fVar201 * (float)uStack_538;
    auVar15._12_4_ = fVar202 * uStack_538._4_4_;
    auVar15._16_4_ = (float)uStack_530 * 0.0;
    auVar15._20_4_ = uStack_530._4_4_ * 0.0;
    auVar15._24_4_ = (float)uStack_528 * 0.0;
    auVar15._28_4_ = DAT_01f7b040._28_4_;
    auVar49._4_4_ = uStack_57c;
    auVar49._0_4_ = local_580;
    auVar49._8_4_ = uStack_578;
    auVar49._12_4_ = uStack_574;
    auVar49._16_4_ = uStack_570;
    auVar49._20_4_ = uStack_56c;
    auVar49._24_4_ = uStack_568;
    auVar49._28_4_ = uStack_564;
    auVar88 = vfmadd231ps_fma(auVar273,auVar211,auVar49);
    auVar57._8_8_ = uStack_498;
    auVar57._0_8_ = local_4a0;
    auVar57._16_8_ = uStack_490;
    auVar57._24_8_ = uStack_488;
    auVar83 = vfmadd231ps_fma(auVar280,auVar211,auVar57);
    auVar55._8_8_ = uStack_4b8;
    auVar55._0_8_ = local_4c0;
    auVar55._16_8_ = uStack_4b0;
    auVar55._24_8_ = uStack_4a8;
    auVar126 = vfmadd231ps_fma(auVar232,auVar211,auVar55);
    auVar53._8_8_ = uStack_4d8;
    auVar53._0_8_ = local_4e0;
    auVar53._16_8_ = uStack_4d0;
    auVar53._24_8_ = uStack_4c8;
    auVar146 = vfmadd231ps_fma(auVar15,auVar211,auVar53);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar197,auVar65);
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar197,auVar67);
    auVar59._8_8_ = uStack_478;
    auVar59._0_8_ = local_480;
    auVar59._16_8_ = uStack_470;
    auVar59._24_8_ = uStack_468;
    auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar197,auVar59);
    auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar66,auVar197);
    auVar51._4_4_ = uStack_55c;
    auVar51._0_4_ = local_560;
    auVar51._8_4_ = uStack_558;
    auVar51._12_4_ = uStack_554;
    auVar51._16_4_ = uStack_550;
    auVar51._20_4_ = uStack_54c;
    auVar51._24_4_ = uStack_548;
    auVar51._28_4_ = uStack_544;
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar133,auVar51);
    auVar61._8_8_ = uStack_458;
    auVar61._0_8_ = local_460;
    auVar61._16_8_ = uStack_450;
    auVar61._24_8_ = uStack_448;
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar133,auVar61);
    auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar133,auVar69);
    auVar146 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar68,auVar133);
    fVar184 = auVar88._0_4_ * fVar162;
    fVar200 = auVar88._4_4_ * fVar162;
    auVar16._4_4_ = fVar200;
    auVar16._0_4_ = fVar184;
    fVar201 = auVar88._8_4_ * fVar162;
    auVar16._8_4_ = fVar201;
    fVar202 = auVar88._12_4_ * fVar162;
    auVar16._12_4_ = fVar202;
    auVar16._16_4_ = fVar162 * 0.0;
    auVar16._20_4_ = fVar162 * 0.0;
    auVar16._24_4_ = fVar162 * 0.0;
    auVar16._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    local_9e0._0_4_ = auVar83._0_4_ * fVar162;
    local_9e0._4_4_ = auVar83._4_4_ * fVar162;
    local_9e0._8_4_ = auVar83._8_4_ * fVar162;
    local_9e0._12_4_ = auVar83._12_4_ * fVar162;
    local_9e0._16_4_ = fVar162 * 0.0;
    local_9e0._20_4_ = fVar162 * 0.0;
    local_9e0._24_4_ = fVar162 * 0.0;
    local_9e0._28_4_ = 0;
    local_a00._0_4_ = auVar126._0_4_ * fVar162;
    local_a00._4_4_ = auVar126._4_4_ * fVar162;
    local_a00._8_4_ = auVar126._8_4_ * fVar162;
    local_a00._12_4_ = auVar126._12_4_ * fVar162;
    local_a00._16_4_ = fVar162 * 0.0;
    local_a00._20_4_ = fVar162 * 0.0;
    local_a00._24_4_ = fVar162 * 0.0;
    local_a00._28_4_ = 0;
    auVar195._0_4_ = fVar162 * auVar146._0_4_;
    auVar195._4_4_ = fVar162 * auVar146._4_4_;
    auVar195._8_4_ = fVar162 * auVar146._8_4_;
    auVar195._12_4_ = fVar162 * auVar146._12_4_;
    auVar195._16_4_ = fVar162 * 0.0;
    auVar195._20_4_ = fVar162 * 0.0;
    auVar195._24_4_ = fVar162 * 0.0;
    auVar195._28_4_ = 0;
    auVar12 = vpermps_avx2(_DAT_01fb7720,auVar102);
    auVar133 = ZEXT1632(auVar92);
    local_960 = vpermps_avx2(_DAT_01fb7720,auVar133);
    local_300 = vsubps_avx(auVar12,auVar102);
    local_2e0 = vsubps_avx(local_960,ZEXT1632(auVar92));
    fVar237 = local_2e0._0_4_;
    fVar163 = local_2e0._4_4_;
    auVar17._4_4_ = fVar163 * fVar200;
    auVar17._0_4_ = fVar237 * fVar184;
    fVar80 = local_2e0._8_4_;
    auVar17._8_4_ = fVar80 * fVar201;
    fVar119 = local_2e0._12_4_;
    auVar17._12_4_ = fVar119 * fVar202;
    fVar159 = local_2e0._16_4_;
    auVar17._16_4_ = fVar159 * fVar162 * 0.0;
    fVar160 = local_2e0._20_4_;
    auVar17._20_4_ = fVar160 * fVar162 * 0.0;
    fVar161 = local_2e0._24_4_;
    auVar17._24_4_ = fVar161 * fVar162 * 0.0;
    auVar17._28_4_ = local_960._28_4_;
    auVar92 = vfmsub231ps_fma(auVar17,local_a00,local_300);
    auVar233 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar84));
    local_320 = vsubps_avx(auVar233,ZEXT1632(auVar84));
    fVar256 = local_300._0_4_;
    fVar120 = local_300._4_4_;
    auVar18._4_4_ = fVar120 * local_9e0._4_4_;
    auVar18._0_4_ = fVar256 * local_9e0._0_4_;
    fVar121 = local_300._8_4_;
    auVar18._8_4_ = fVar121 * local_9e0._8_4_;
    fVar122 = local_300._12_4_;
    auVar18._12_4_ = fVar122 * local_9e0._12_4_;
    fVar123 = local_300._16_4_;
    auVar18._16_4_ = fVar123 * local_9e0._16_4_;
    fVar124 = local_300._20_4_;
    auVar18._20_4_ = fVar124 * local_9e0._20_4_;
    fVar142 = local_300._24_4_;
    auVar18._24_4_ = fVar142 * local_9e0._24_4_;
    auVar18._28_4_ = auVar233._28_4_;
    auVar88 = vfmsub231ps_fma(auVar18,auVar16,local_320);
    auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar88._12_4_ * auVar88._12_4_,
                                                 CONCAT48(auVar88._8_4_ * auVar88._8_4_,
                                                          CONCAT44(auVar88._4_4_ * auVar88._4_4_,
                                                                   auVar88._0_4_ * auVar88._0_4_))))
                              ,ZEXT1632(auVar92),ZEXT1632(auVar92));
    fVar235 = local_320._0_4_;
    auVar220._0_4_ = fVar235 * local_a00._0_4_;
    fVar236 = local_320._4_4_;
    auVar220._4_4_ = fVar236 * local_a00._4_4_;
    fVar162 = local_320._8_4_;
    auVar220._8_4_ = fVar162 * local_a00._8_4_;
    fVar242 = local_320._12_4_;
    auVar220._12_4_ = fVar242 * local_a00._12_4_;
    fVar252 = local_320._16_4_;
    auVar220._16_4_ = fVar252 * local_a00._16_4_;
    fVar253 = local_320._20_4_;
    auVar220._20_4_ = fVar253 * local_a00._20_4_;
    fVar255 = local_320._24_4_;
    auVar220._24_4_ = fVar255 * local_a00._24_4_;
    auVar220._28_4_ = 0;
    auVar88 = vfmsub231ps_fma(auVar220,local_9e0,local_2e0);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar88),ZEXT1632(auVar88));
    auVar221._0_4_ = fVar237 * fVar237;
    auVar221._4_4_ = fVar163 * fVar163;
    auVar221._8_4_ = fVar80 * fVar80;
    auVar221._12_4_ = fVar119 * fVar119;
    auVar221._16_4_ = fVar159 * fVar159;
    auVar221._20_4_ = fVar160 * fVar160;
    auVar221._24_4_ = fVar161 * fVar161;
    auVar221._28_4_ = 0;
    auVar92 = vfmadd231ps_fma(auVar221,local_320,local_320);
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar92),local_300,local_300);
    auVar132 = vrcpps_avx(ZEXT1632(auVar83));
    auVar103._8_4_ = 0x3f800000;
    auVar103._0_8_ = 0x3f8000003f800000;
    auVar103._12_4_ = 0x3f800000;
    auVar103._16_4_ = 0x3f800000;
    auVar103._20_4_ = 0x3f800000;
    auVar103._24_4_ = 0x3f800000;
    auVar103._28_4_ = 0x3f800000;
    auVar92 = vfnmadd213ps_fma(auVar132,ZEXT1632(auVar83),auVar103);
    auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar132,auVar132);
    local_7a0 = vpermps_avx2(_DAT_01fb7720,auVar16);
    local_7c0 = vpermps_avx2(_DAT_01fb7720,local_a00);
    auVar19._4_4_ = fVar163 * local_7a0._4_4_;
    auVar19._0_4_ = fVar237 * local_7a0._0_4_;
    auVar19._8_4_ = fVar80 * local_7a0._8_4_;
    auVar19._12_4_ = fVar119 * local_7a0._12_4_;
    auVar19._16_4_ = fVar159 * local_7a0._16_4_;
    auVar19._20_4_ = fVar160 * local_7a0._20_4_;
    auVar19._24_4_ = fVar161 * local_7a0._24_4_;
    auVar19._28_4_ = auVar132._28_4_;
    auVar126 = vfmsub231ps_fma(auVar19,local_7c0,local_300);
    local_7e0 = vpermps_avx2(_DAT_01fb7720,local_9e0);
    auVar20._4_4_ = fVar120 * local_7e0._4_4_;
    auVar20._0_4_ = fVar256 * local_7e0._0_4_;
    auVar20._8_4_ = fVar121 * local_7e0._8_4_;
    auVar20._12_4_ = fVar122 * local_7e0._12_4_;
    auVar20._16_4_ = fVar123 * local_7e0._16_4_;
    auVar20._20_4_ = fVar124 * local_7e0._20_4_;
    auVar20._24_4_ = fVar142 * local_7e0._24_4_;
    auVar20._28_4_ = 0;
    auVar146 = vfmsub231ps_fma(auVar20,local_7a0,local_320);
    auVar126 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar146._12_4_ * auVar146._12_4_,
                                                  CONCAT48(auVar146._8_4_ * auVar146._8_4_,
                                                           CONCAT44(auVar146._4_4_ * auVar146._4_4_,
                                                                    auVar146._0_4_ * auVar146._0_4_)
                                                          ))),ZEXT1632(auVar126),ZEXT1632(auVar126))
    ;
    auVar229._0_4_ = fVar235 * local_7c0._0_4_;
    auVar229._4_4_ = fVar236 * local_7c0._4_4_;
    auVar229._8_4_ = fVar162 * local_7c0._8_4_;
    auVar229._12_4_ = fVar242 * local_7c0._12_4_;
    auVar229._16_4_ = fVar252 * local_7c0._16_4_;
    auVar229._20_4_ = fVar253 * local_7c0._20_4_;
    auVar229._24_4_ = fVar255 * local_7c0._24_4_;
    auVar229._28_4_ = 0;
    auVar146 = vfmsub231ps_fma(auVar229,local_7e0,local_2e0);
    auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT1632(auVar146),ZEXT1632(auVar146));
    auVar132 = vmaxps_avx(ZEXT1632(CONCAT412(auVar92._12_4_ * auVar88._12_4_,
                                             CONCAT48(auVar92._8_4_ * auVar88._8_4_,
                                                      CONCAT44(auVar92._4_4_ * auVar88._4_4_,
                                                               auVar92._0_4_ * auVar88._0_4_)))),
                          ZEXT1632(CONCAT412(auVar126._12_4_ * auVar92._12_4_,
                                             CONCAT48(auVar126._8_4_ * auVar92._8_4_,
                                                      CONCAT44(auVar126._4_4_ * auVar92._4_4_,
                                                               auVar126._0_4_ * auVar92._0_4_)))));
    auVar228._0_4_ = auVar195._0_4_ + auVar127._0_4_;
    auVar228._4_4_ = auVar195._4_4_ + auVar127._4_4_;
    auVar228._8_4_ = auVar195._8_4_ + auVar127._8_4_;
    auVar228._12_4_ = auVar195._12_4_ + auVar127._12_4_;
    auVar228._16_4_ = auVar195._16_4_ + 0.0;
    auVar228._20_4_ = auVar195._20_4_ + 0.0;
    auVar228._24_4_ = auVar195._24_4_ + 0.0;
    auVar230._28_4_ = 0;
    auVar230._0_28_ = auVar228;
    auVar113 = vsubps_avx(ZEXT1632(auVar127),auVar195);
    local_620 = vpermps_avx2(_DAT_01fb7720,auVar113);
    auVar211 = ZEXT1632(auVar127);
    local_640 = vpermps_avx2(_DAT_01fb7720,auVar211);
    auVar113 = vmaxps_avx(auVar211,auVar230);
    auVar7 = vmaxps_avx(local_620,local_640);
    auVar113 = vmaxps_avx(auVar113,auVar7);
    auVar7 = vrsqrtps_avx(ZEXT1632(auVar83));
    fVar184 = auVar7._0_4_;
    fVar200 = auVar7._4_4_;
    fVar201 = auVar7._8_4_;
    fVar202 = auVar7._12_4_;
    fVar81 = auVar7._16_4_;
    fVar254 = auVar7._20_4_;
    fVar183 = auVar7._24_4_;
    auVar21._4_4_ = fVar200 * fVar200 * fVar200 * auVar83._4_4_ * -0.5;
    auVar21._0_4_ = fVar184 * fVar184 * fVar184 * auVar83._0_4_ * -0.5;
    auVar21._8_4_ = fVar201 * fVar201 * fVar201 * auVar83._8_4_ * -0.5;
    auVar21._12_4_ = fVar202 * fVar202 * fVar202 * auVar83._12_4_ * -0.5;
    auVar21._16_4_ = fVar81 * fVar81 * fVar81 * -0.0;
    auVar21._20_4_ = fVar254 * fVar254 * fVar254 * -0.0;
    auVar21._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
    auVar21._28_4_ = local_7c0._28_4_;
    auVar196._8_4_ = 0x3fc00000;
    auVar196._0_8_ = 0x3fc000003fc00000;
    auVar196._12_4_ = 0x3fc00000;
    auVar196._16_4_ = 0x3fc00000;
    auVar196._20_4_ = 0x3fc00000;
    auVar196._24_4_ = 0x3fc00000;
    auVar196._28_4_ = 0x3fc00000;
    local_a80 = vfmadd231ps_fma(auVar21,auVar196,auVar7);
    auStack_a70 = (undefined1  [16])0x0;
    fVar200 = local_a80._0_4_;
    fVar201 = local_a80._4_4_;
    auVar22._4_4_ = fVar236 * fVar201;
    auVar22._0_4_ = fVar235 * fVar200;
    fVar81 = local_a80._8_4_;
    auVar22._8_4_ = fVar162 * fVar81;
    fVar183 = local_a80._12_4_;
    auVar22._12_4_ = fVar242 * fVar183;
    auVar22._16_4_ = fVar252 * 0.0;
    auVar22._20_4_ = fVar253 * 0.0;
    uVar76 = auVar7._28_4_;
    auVar22._24_4_ = fVar255 * 0.0;
    auVar22._28_4_ = uVar76;
    auVar23._4_4_ = (float)local_820._4_4_ * fVar163 * fVar201;
    auVar23._0_4_ = (float)local_820._0_4_ * fVar237 * fVar200;
    auVar23._8_4_ = fStack_818 * fVar80 * fVar81;
    auVar23._12_4_ = fStack_814 * fVar119 * fVar183;
    auVar23._16_4_ = fStack_810 * fVar159 * 0.0;
    auVar23._20_4_ = fStack_80c * fVar160 * 0.0;
    auVar23._24_4_ = fStack_808 * fVar161 * 0.0;
    auVar23._28_4_ = local_2e0._28_4_;
    auVar92 = vfmadd231ps_fma(auVar23,auVar22,_local_840);
    local_800 = vsubps_avx(ZEXT832(0) << 0x20,auVar133);
    fVar235 = local_800._0_4_;
    fVar236 = local_800._4_4_;
    auVar24._4_4_ = fVar236 * fVar163 * fVar201;
    auVar24._0_4_ = fVar235 * fVar237 * fVar200;
    fVar237 = local_800._8_4_;
    auVar24._8_4_ = fVar237 * fVar80 * fVar81;
    fVar162 = local_800._12_4_;
    auVar24._12_4_ = fVar162 * fVar119 * fVar183;
    fVar163 = local_800._16_4_;
    auVar24._16_4_ = fVar163 * fVar159 * 0.0;
    fVar80 = local_800._20_4_;
    auVar24._20_4_ = fVar80 * fVar160 * 0.0;
    fVar119 = local_800._24_4_;
    auVar24._24_4_ = fVar119 * fVar161 * 0.0;
    auVar24._28_4_ = 0x3fc00000;
    local_2c0 = ZEXT1632(auVar84);
    auVar284 = vsubps_avx(ZEXT832(0) << 0x20,local_2c0);
    auVar234 = ZEXT3264(auVar284);
    auVar84 = vfmadd231ps_fma(auVar24,auVar284,auVar22);
    auVar25._4_4_ = fVar120 * fVar201;
    auVar25._0_4_ = fVar256 * fVar200;
    auVar25._8_4_ = fVar121 * fVar81;
    auVar25._12_4_ = fVar122 * fVar183;
    auVar25._16_4_ = fVar123 * 0.0;
    auVar25._20_4_ = fVar124 * 0.0;
    auVar25._24_4_ = fVar142 * 0.0;
    auVar25._28_4_ = uVar76;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar25,_local_6a0);
    auVar274 = ZEXT1664(auVar92);
    auVar280 = ZEXT832(0) << 0x20;
    auVar110 = vsubps_avx(auVar280,auVar102);
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar110,auVar25);
    auVar7 = vsqrtps_avx(auVar132);
    auVar26._4_4_ = (float)local_820._4_4_ * fVar236;
    auVar26._0_4_ = (float)local_820._0_4_ * fVar235;
    auVar26._8_4_ = fStack_818 * fVar237;
    auVar26._12_4_ = fStack_814 * fVar162;
    auVar26._16_4_ = fStack_810 * fVar163;
    auVar26._20_4_ = fStack_80c * fVar80;
    auVar26._24_4_ = fStack_808 * fVar119;
    auVar26._28_4_ = uVar76;
    auVar127 = vfmadd231ps_fma(auVar26,_local_840,auVar284);
    auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),_local_6a0,auVar110);
    fVar184 = auVar84._0_4_;
    fVar123 = auVar92._0_4_;
    fVar202 = auVar84._4_4_;
    fVar124 = auVar92._4_4_;
    fVar254 = auVar84._8_4_;
    fVar142 = auVar92._8_4_;
    fVar256 = auVar84._12_4_;
    fVar159 = auVar92._12_4_;
    auVar27._28_4_ = auVar132._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar159 * fVar256,
                            CONCAT48(fVar142 * fVar254,CONCAT44(fVar124 * fVar202,fVar123 * fVar184)
                                    )));
    auVar11 = vsubps_avx(ZEXT1632(auVar127),auVar27);
    auVar28._4_4_ = fVar236 * fVar236;
    auVar28._0_4_ = fVar235 * fVar235;
    auVar28._8_4_ = fVar237 * fVar237;
    auVar28._12_4_ = fVar162 * fVar162;
    auVar28._16_4_ = fVar163 * fVar163;
    auVar28._20_4_ = fVar80 * fVar80;
    auVar28._24_4_ = fVar119 * fVar119;
    auVar28._28_4_ = auVar132._28_4_;
    auVar127 = vfmadd231ps_fma(auVar28,auVar284,auVar284);
    auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar110,auVar110);
    local_660 = vsubps_avx(ZEXT1632(auVar127),
                           ZEXT1632(CONCAT412(fVar256 * fVar256,
                                              CONCAT48(fVar254 * fVar254,
                                                       CONCAT44(fVar202 * fVar202,fVar184 * fVar184)
                                                      ))));
    fVar184 = (auVar7._0_4_ + auVar113._0_4_) * 1.0000002;
    fVar202 = (auVar7._4_4_ + auVar113._4_4_) * 1.0000002;
    fVar254 = (auVar7._8_4_ + auVar113._8_4_) * 1.0000002;
    fVar256 = (auVar7._12_4_ + auVar113._12_4_) * 1.0000002;
    fVar120 = (auVar7._16_4_ + auVar113._16_4_) * 1.0000002;
    fVar121 = (auVar7._20_4_ + auVar113._20_4_) * 1.0000002;
    fVar122 = (auVar7._24_4_ + auVar113._24_4_) * 1.0000002;
    auVar29._4_4_ = fVar202 * fVar202;
    auVar29._0_4_ = fVar184 * fVar184;
    auVar29._8_4_ = fVar254 * fVar254;
    auVar29._12_4_ = fVar256 * fVar256;
    auVar29._16_4_ = fVar120 * fVar120;
    auVar29._20_4_ = fVar121 * fVar121;
    auVar29._24_4_ = fVar122 * fVar122;
    auVar29._28_4_ = auVar7._28_4_ + auVar113._28_4_;
    fVar160 = auVar11._0_4_ + auVar11._0_4_;
    fVar161 = auVar11._4_4_ + auVar11._4_4_;
    local_3a0._0_8_ = CONCAT44(fVar161,fVar160);
    local_3a0._8_4_ = auVar11._8_4_ + auVar11._8_4_;
    local_3a0._12_4_ = auVar11._12_4_ + auVar11._12_4_;
    local_3a0._16_4_ = auVar11._16_4_ + auVar11._16_4_;
    local_3a0._20_4_ = auVar11._20_4_ + auVar11._20_4_;
    local_3a0._24_4_ = auVar11._24_4_ + auVar11._24_4_;
    fVar184 = auVar11._28_4_;
    local_3a0._28_4_ = fVar184 + fVar184;
    auVar113 = vsubps_avx(local_660,auVar29);
    auVar273 = ZEXT1632(auVar92);
    auVar30._28_4_ = uStack_804;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(fVar159 * fVar159,
                            CONCAT48(fVar142 * fVar142,CONCAT44(fVar124 * fVar124,fVar123 * fVar123)
                                    )));
    auVar11 = vsubps_avx(local_260,auVar30);
    auVar215 = ZEXT3264(auVar11);
    local_680._0_4_ = fVar160 * fVar160;
    local_680._4_4_ = fVar161 * fVar161;
    local_680._8_4_ = local_3a0._8_4_ * local_3a0._8_4_;
    local_680._12_4_ = local_3a0._12_4_ * local_3a0._12_4_;
    local_680._16_4_ = local_3a0._16_4_ * local_3a0._16_4_;
    local_680._20_4_ = local_3a0._20_4_ * local_3a0._20_4_;
    local_680._24_4_ = local_3a0._24_4_ * local_3a0._24_4_;
    local_680._28_4_ = 0;
    fVar202 = auVar11._0_4_;
    local_2a0 = fVar202 * 4.0;
    fVar254 = auVar11._4_4_;
    fStack_29c = fVar254 * 4.0;
    fVar256 = auVar11._8_4_;
    fStack_298 = fVar256 * 4.0;
    fVar120 = auVar11._12_4_;
    fStack_294 = fVar120 * 4.0;
    fVar121 = auVar11._16_4_;
    fStack_290 = fVar121 * 4.0;
    fVar122 = auVar11._20_4_;
    fStack_28c = fVar122 * 4.0;
    fVar123 = auVar11._24_4_;
    fStack_288 = fVar123 * 4.0;
    uStack_284 = 0x40800000;
    auVar31._4_4_ = auVar113._4_4_ * fStack_29c;
    auVar31._0_4_ = auVar113._0_4_ * local_2a0;
    auVar31._8_4_ = auVar113._8_4_ * fStack_298;
    auVar31._12_4_ = auVar113._12_4_ * fStack_294;
    auVar31._16_4_ = auVar113._16_4_ * fStack_290;
    auVar31._20_4_ = auVar113._20_4_ * fStack_28c;
    auVar31._24_4_ = auVar113._24_4_ * fStack_288;
    auVar31._28_4_ = fVar184;
    auVar222 = vsubps_avx(local_680,auVar31);
    auVar132 = vcmpps_avx(auVar222,auVar280,5);
    auVar152._0_4_ = fVar202 + fVar202;
    auVar152._4_4_ = fVar254 + fVar254;
    auVar152._8_4_ = fVar256 + fVar256;
    auVar152._12_4_ = fVar120 + fVar120;
    auVar152._16_4_ = fVar121 + fVar121;
    auVar152._20_4_ = fVar122 + fVar122;
    auVar152._24_4_ = fVar123 + fVar123;
    auVar152._28_4_ = auVar11._28_4_ + auVar11._28_4_;
    auVar197 = ZEXT1632(auVar84);
    if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar132 >> 0x7f,0) == '\0') &&
          (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar132 >> 0xbf,0) == '\0') &&
        (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar132[0x1f])
    {
      local_a20._8_4_ = 0x7f800000;
      local_a20._0_8_ = 0x7f8000007f800000;
      local_a20._12_4_ = 0x7f800000;
      local_a20._16_4_ = 0x7f800000;
      local_a20._20_4_ = 0x7f800000;
      local_a20._24_4_ = 0x7f800000;
      local_a20._28_4_ = 0x7f800000;
      auVar281._8_4_ = 0xff800000;
      auVar281._0_8_ = 0xff800000ff800000;
      auVar281._12_4_ = 0xff800000;
      auVar281._16_4_ = 0xff800000;
      auVar281._20_4_ = 0xff800000;
      auVar281._24_4_ = 0xff800000;
      auVar281._28_4_ = 0xff800000;
    }
    else {
      auVar232 = vsqrtps_avx(auVar222);
      auVar280 = vcmpps_avx(auVar222,auVar280,5);
      auVar222 = vrcpps_avx(auVar152);
      auVar104._8_4_ = 0x3f800000;
      auVar104._0_8_ = 0x3f8000003f800000;
      auVar104._12_4_ = 0x3f800000;
      auVar104._16_4_ = 0x3f800000;
      auVar104._20_4_ = 0x3f800000;
      auVar104._24_4_ = 0x3f800000;
      auVar104._28_4_ = 0x3f800000;
      local_6c0 = auVar152;
      auVar92 = vfnmadd213ps_fma(auVar222,auVar152,auVar104);
      auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar222,auVar222);
      auVar285._0_8_ = CONCAT44(fVar161,fVar160) ^ 0x8000000080000000;
      auVar285._8_4_ = -local_3a0._8_4_;
      auVar285._12_4_ = -local_3a0._12_4_;
      auVar285._16_4_ = -local_3a0._16_4_;
      auVar285._20_4_ = -local_3a0._20_4_;
      auVar285._24_4_ = -local_3a0._24_4_;
      auVar285._28_4_ = -local_3a0._28_4_;
      auVar222 = vsubps_avx(auVar285,auVar232);
      auVar32._4_4_ = auVar222._4_4_ * auVar92._4_4_;
      auVar32._0_4_ = auVar222._0_4_ * auVar92._0_4_;
      auVar32._8_4_ = auVar222._8_4_ * auVar92._8_4_;
      auVar32._12_4_ = auVar222._12_4_ * auVar92._12_4_;
      auVar32._16_4_ = auVar222._16_4_ * 0.0;
      auVar32._20_4_ = auVar222._20_4_ * 0.0;
      auVar32._24_4_ = auVar222._24_4_ * 0.0;
      auVar32._28_4_ = auVar222._28_4_;
      auVar222 = vsubps_avx(auVar232,local_3a0);
      auVar282._0_4_ = auVar222._0_4_ * auVar92._0_4_;
      auVar282._4_4_ = auVar222._4_4_ * auVar92._4_4_;
      auVar282._8_4_ = auVar222._8_4_ * auVar92._8_4_;
      auVar282._12_4_ = auVar222._12_4_ * auVar92._12_4_;
      auVar282._16_4_ = auVar222._16_4_ * 0.0;
      auVar282._20_4_ = auVar222._20_4_ * 0.0;
      auVar282._24_4_ = auVar222._24_4_ * 0.0;
      auVar282._28_4_ = 0;
      auVar92 = vfmadd213ps_fma(auVar273,auVar32,auVar197);
      local_360 = auVar92._0_4_ * fVar200;
      fStack_35c = auVar92._4_4_ * fVar201;
      fStack_358 = auVar92._8_4_ * fVar81;
      fStack_354 = auVar92._12_4_ * fVar183;
      uStack_350 = 0;
      uStack_34c = 0;
      uStack_348 = 0;
      uStack_344 = 0x80000000;
      auVar222 = vandps_avx(auVar30,local_8a0);
      auVar222 = vmaxps_avx(local_5e0,auVar222);
      auVar33._4_4_ = auVar222._4_4_ * 1.9073486e-06;
      auVar33._0_4_ = auVar222._0_4_ * 1.9073486e-06;
      auVar33._8_4_ = auVar222._8_4_ * 1.9073486e-06;
      auVar33._12_4_ = auVar222._12_4_ * 1.9073486e-06;
      auVar33._16_4_ = auVar222._16_4_ * 1.9073486e-06;
      auVar33._20_4_ = auVar222._20_4_ * 1.9073486e-06;
      auVar33._24_4_ = auVar222._24_4_ * 1.9073486e-06;
      auVar33._28_4_ = auVar222._28_4_;
      auVar222 = vandps_avx(local_8a0,auVar11);
      auVar222 = vcmpps_avx(auVar222,auVar33,1);
      auVar92 = vfmadd213ps_fma(auVar273,auVar282,auVar197);
      auVar105._8_4_ = 0x7f800000;
      auVar105._0_8_ = 0x7f8000007f800000;
      auVar105._12_4_ = 0x7f800000;
      auVar105._16_4_ = 0x7f800000;
      auVar105._20_4_ = 0x7f800000;
      auVar105._24_4_ = 0x7f800000;
      auVar105._28_4_ = 0x7f800000;
      local_a20 = vblendvps_avx(auVar105,auVar32,auVar280);
      local_380 = auVar92._0_4_ * fVar200;
      fStack_37c = auVar92._4_4_ * fVar201;
      fStack_378 = auVar92._8_4_ * fVar81;
      fStack_374 = auVar92._12_4_ * fVar183;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = local_a20._28_4_;
      auVar275._8_4_ = 0xff800000;
      auVar275._0_8_ = 0xff800000ff800000;
      auVar275._12_4_ = 0xff800000;
      auVar275._16_4_ = 0xff800000;
      auVar275._20_4_ = 0xff800000;
      auVar275._24_4_ = 0xff800000;
      auVar275._28_4_ = 0xff800000;
      auVar281 = vblendvps_avx(auVar275,auVar282,auVar280);
      auVar232 = auVar280 & auVar222;
      if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar232 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar232 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar232 >> 0x7f,0) != '\0') ||
            (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar232 >> 0xbf,0) != '\0') ||
          (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar232[0x1f] < '\0') {
        auVar132 = vandps_avx(auVar222,auVar280);
        auVar222 = vcmpps_avx(auVar113,_DAT_01f7b000,2);
        auVar288._8_4_ = 0xff800000;
        auVar288._0_8_ = 0xff800000ff800000;
        auVar288._12_4_ = 0xff800000;
        auVar288._16_4_ = 0xff800000;
        auVar288._20_4_ = 0xff800000;
        auVar288._24_4_ = 0xff800000;
        auVar288._28_4_ = 0xff800000;
        auVar117._8_4_ = 0x7f800000;
        auVar117._0_8_ = 0x7f8000007f800000;
        auVar117._12_4_ = 0x7f800000;
        auVar117._16_4_ = 0x7f800000;
        auVar117._20_4_ = 0x7f800000;
        auVar117._24_4_ = 0x7f800000;
        auVar117._28_4_ = 0x7f800000;
        auVar113 = vblendvps_avx(auVar117,auVar288,auVar222);
        auVar92 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
        auVar232 = vpmovsxwd_avx2(auVar92);
        local_a20 = vblendvps_avx(local_a20,auVar113,auVar232);
        auVar156._8_4_ = 0xff800000;
        auVar156._0_8_ = 0xff800000ff800000;
        auVar156._12_4_ = 0xff800000;
        auVar156._16_4_ = 0xff800000;
        auVar156._20_4_ = 0xff800000;
        auVar156._24_4_ = 0xff800000;
        auVar156._28_4_ = 0xff800000;
        auVar113 = vblendvps_avx(auVar156,auVar117,auVar222);
        auVar281 = vblendvps_avx(auVar281,auVar113,auVar232);
        auVar250._0_8_ = auVar132._0_8_ ^ 0xffffffffffffffff;
        auVar250._8_4_ = auVar132._8_4_ ^ 0xffffffff;
        auVar250._12_4_ = auVar132._12_4_ ^ 0xffffffff;
        auVar250._16_4_ = auVar132._16_4_ ^ 0xffffffff;
        auVar250._20_4_ = auVar132._20_4_ ^ 0xffffffff;
        auVar250._24_4_ = auVar132._24_4_ ^ 0xffffffff;
        auVar250._28_4_ = auVar132._28_4_ ^ 0xffffffff;
        auVar132 = vorps_avx(auVar222,auVar250);
        auVar132 = vandps_avx(auVar132,auVar280);
      }
    }
    auVar271 = ZEXT3264(auVar7);
    auVar266 = ZEXT3264(_local_980);
    auVar251 = ZEXT3264(local_5c0);
    auVar113 = local_5c0 & auVar132;
    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar113 >> 0x7f,0) != '\0') ||
          (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar113 >> 0xbf,0) != '\0') ||
        (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar113[0x1f] < '\0') {
      local_6c0 = auVar30;
      auVar266 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar184 = *(float *)(ray + k * 4 + 0x80) - (float)local_930._0_4_;
      auVar178._4_4_ = fVar184;
      auVar178._0_4_ = fVar184;
      auVar178._8_4_ = fVar184;
      auVar178._12_4_ = fVar184;
      auVar178._16_4_ = fVar184;
      auVar178._20_4_ = fVar184;
      auVar178._24_4_ = fVar184;
      auVar178._28_4_ = fVar184;
      auVar280 = vminps_avx(auVar178,auVar281);
      auVar34._4_4_ = local_a00._4_4_ * fVar236;
      auVar34._0_4_ = local_a00._0_4_ * fVar235;
      auVar34._8_4_ = local_a00._8_4_ * fVar237;
      auVar34._12_4_ = local_a00._12_4_ * fVar162;
      auVar34._16_4_ = local_a00._16_4_ * fVar163;
      auVar34._20_4_ = local_a00._20_4_ * fVar80;
      auVar34._24_4_ = local_a00._24_4_ * fVar119;
      auVar34._28_4_ = uStack_804;
      auVar92 = vfmadd213ps_fma(auVar284,local_9e0,auVar34);
      auVar64._4_4_ = fStack_33c;
      auVar64._0_4_ = local_340;
      auVar64._8_4_ = fStack_338;
      auVar64._12_4_ = fStack_334;
      auVar64._16_4_ = fStack_330;
      auVar64._20_4_ = fStack_32c;
      auVar64._24_4_ = fStack_328;
      auVar64._28_4_ = fStack_324;
      auVar222 = vmaxps_avx(auVar64,local_a20);
      auVar84 = vfmadd213ps_fma(auVar110,auVar16,ZEXT1632(auVar92));
      auVar231._0_4_ = local_a00._0_4_ * (float)local_820._0_4_;
      auVar231._4_4_ = local_a00._4_4_ * (float)local_820._4_4_;
      auVar231._8_4_ = local_a00._8_4_ * fStack_818;
      auVar231._12_4_ = local_a00._12_4_ * fStack_814;
      auVar231._16_4_ = local_a00._16_4_ * fStack_810;
      auVar231._20_4_ = local_a00._20_4_ * fStack_80c;
      auVar231._24_4_ = local_a00._24_4_ * fStack_808;
      auVar231._28_4_ = 0;
      auVar92 = vfmadd231ps_fma(auVar231,local_9e0,_local_840);
      auVar127 = vfmadd231ps_fma(ZEXT1632(auVar92),_local_6a0,auVar16);
      auVar113 = vandps_avx(ZEXT1632(auVar127),local_8a0);
      auVar106._8_4_ = 0x219392ef;
      auVar106._0_8_ = 0x219392ef219392ef;
      auVar106._12_4_ = 0x219392ef;
      auVar106._16_4_ = 0x219392ef;
      auVar106._20_4_ = 0x219392ef;
      auVar106._24_4_ = 0x219392ef;
      auVar106._28_4_ = 0x219392ef;
      auVar284 = vcmpps_avx(auVar113,auVar106,1);
      auVar113 = vrcpps_avx(ZEXT1632(auVar127));
      auVar107._8_4_ = 0x3f800000;
      auVar107._0_8_ = 0x3f8000003f800000;
      auVar107._12_4_ = 0x3f800000;
      auVar107._16_4_ = 0x3f800000;
      auVar107._20_4_ = 0x3f800000;
      auVar107._24_4_ = 0x3f800000;
      auVar107._28_4_ = 0x3f800000;
      auVar232 = ZEXT1632(auVar127);
      auVar92 = vfnmadd213ps_fma(auVar113,auVar232,auVar107);
      auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar113,auVar113);
      auVar276._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
      auVar276._8_4_ = auVar127._8_4_ ^ 0x80000000;
      auVar276._12_4_ = auVar127._12_4_ ^ 0x80000000;
      auVar276._16_4_ = 0x80000000;
      auVar276._20_4_ = 0x80000000;
      auVar276._24_4_ = 0x80000000;
      auVar276._28_4_ = 0x80000000;
      auVar283._0_4_ = auVar92._0_4_ * -auVar84._0_4_;
      auVar283._4_4_ = auVar92._4_4_ * -auVar84._4_4_;
      auVar283._8_4_ = auVar92._8_4_ * -auVar84._8_4_;
      auVar283._12_4_ = auVar92._12_4_ * -auVar84._12_4_;
      auVar283._16_4_ = 0x80000000;
      auVar283._20_4_ = 0x80000000;
      auVar283._24_4_ = 0x80000000;
      auVar283._28_4_ = 0;
      auVar113 = vcmpps_avx(auVar232,auVar276,1);
      auVar113 = vorps_avx(auVar284,auVar113);
      auVar286._8_4_ = 0xff800000;
      auVar286._0_8_ = 0xff800000ff800000;
      auVar286._12_4_ = 0xff800000;
      auVar286._16_4_ = 0xff800000;
      auVar286._20_4_ = 0xff800000;
      auVar286._24_4_ = 0xff800000;
      auVar286._28_4_ = 0xff800000;
      auVar113 = vblendvps_avx(auVar283,auVar286,auVar113);
      auVar110 = vmaxps_avx(auVar222,auVar113);
      auVar113 = vcmpps_avx(auVar232,auVar276,6);
      auVar113 = vorps_avx(auVar284,auVar113);
      auVar287._8_4_ = 0x7f800000;
      auVar287._0_8_ = 0x7f8000007f800000;
      auVar287._12_4_ = 0x7f800000;
      auVar287._16_4_ = 0x7f800000;
      auVar287._20_4_ = 0x7f800000;
      auVar287._24_4_ = 0x7f800000;
      auVar287._28_4_ = 0x7f800000;
      auVar113 = vblendvps_avx(auVar283,auVar287,auVar113);
      auVar222 = vminps_avx(auVar280,auVar113);
      fVar184 = -local_7c0._0_4_;
      fVar202 = -local_7c0._4_4_;
      fVar254 = -local_7c0._8_4_;
      fVar256 = -local_7c0._12_4_;
      fVar235 = -local_7c0._16_4_;
      fVar236 = -local_7c0._20_4_;
      fVar237 = -local_7c0._24_4_;
      auVar239._0_8_ = local_7e0._0_8_ ^ 0x8000000080000000;
      auVar239._8_4_ = -local_7e0._8_4_;
      auVar239._12_4_ = -local_7e0._12_4_;
      auVar239._16_4_ = -local_7e0._16_4_;
      auVar239._20_4_ = -local_7e0._20_4_;
      auVar239._24_4_ = -local_7e0._24_4_;
      auVar239._28_4_ = local_7e0._28_4_ ^ 0x80000000;
      auVar284 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar113 = vsubps_avx(auVar284,auVar233);
      auVar284 = vsubps_avx(auVar284,local_960);
      auVar35._4_4_ = auVar284._4_4_ * fVar202;
      auVar35._0_4_ = auVar284._0_4_ * fVar184;
      auVar35._8_4_ = auVar284._8_4_ * fVar254;
      auVar35._12_4_ = auVar284._12_4_ * fVar256;
      auVar35._16_4_ = auVar284._16_4_ * fVar235;
      auVar35._20_4_ = auVar284._20_4_ * fVar236;
      auVar35._24_4_ = auVar284._24_4_ * fVar237;
      auVar35._28_4_ = auVar284._28_4_;
      auVar92 = vfmadd231ps_fma(auVar35,auVar239,auVar113);
      auVar247._0_8_ = local_7a0._0_8_ ^ 0x8000000080000000;
      auVar247._8_4_ = -local_7a0._8_4_;
      auVar247._12_4_ = -local_7a0._12_4_;
      auVar247._16_4_ = -local_7a0._16_4_;
      auVar247._20_4_ = -local_7a0._20_4_;
      auVar247._24_4_ = -local_7a0._24_4_;
      auVar247._28_4_ = local_7a0._28_4_ ^ 0x80000000;
      auVar113 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar12);
      auVar84 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar247,auVar113);
      auVar36._4_4_ = fVar202 * (float)local_820._4_4_;
      auVar36._0_4_ = fVar184 * (float)local_820._0_4_;
      auVar36._8_4_ = fVar254 * fStack_818;
      auVar36._12_4_ = fVar256 * fStack_814;
      auVar36._16_4_ = fVar235 * fStack_810;
      auVar36._20_4_ = fVar236 * fStack_80c;
      auVar36._24_4_ = fVar237 * fStack_808;
      auVar36._28_4_ = local_7c0._28_4_ ^ 0x80000000;
      auVar92 = vfmadd231ps_fma(auVar36,auVar239,_local_840);
      auVar127 = vfmadd231ps_fma(ZEXT1632(auVar92),_local_6a0,auVar247);
      auVar113 = vandps_avx(ZEXT1632(auVar127),local_8a0);
      auVar12 = vrcpps_avx(ZEXT1632(auVar127));
      auVar179._8_4_ = 0x219392ef;
      auVar179._0_8_ = 0x219392ef219392ef;
      auVar179._12_4_ = 0x219392ef;
      auVar179._16_4_ = 0x219392ef;
      auVar179._20_4_ = 0x219392ef;
      auVar179._24_4_ = 0x219392ef;
      auVar179._28_4_ = 0x219392ef;
      auVar284 = vcmpps_avx(auVar113,auVar179,1);
      auVar233 = ZEXT1632(auVar127);
      auVar92 = vfnmadd213ps_fma(auVar12,auVar233,auVar107);
      auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar12,auVar12);
      local_860 = (undefined1  [8])(auVar127._0_8_ ^ 0x8000000080000000);
      fStack_858 = (float)(auVar127._8_4_ ^ 0x80000000);
      fStack_854 = (float)(auVar127._12_4_ ^ 0x80000000);
      fStack_850 = -0.0;
      fStack_84c = -0.0;
      fStack_848 = -0.0;
      fStack_844 = -0.0;
      auVar37._4_4_ = auVar92._4_4_ * -auVar84._4_4_;
      auVar37._0_4_ = auVar92._0_4_ * -auVar84._0_4_;
      auVar37._8_4_ = auVar92._8_4_ * -auVar84._8_4_;
      auVar37._12_4_ = auVar92._12_4_ * -auVar84._12_4_;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      auVar113 = vcmpps_avx(auVar233,_local_860,1);
      auVar113 = vorps_avx(auVar284,auVar113);
      auVar108._8_4_ = 0xff800000;
      auVar108._0_8_ = 0xff800000ff800000;
      auVar108._12_4_ = 0xff800000;
      auVar108._16_4_ = 0xff800000;
      auVar108._20_4_ = 0xff800000;
      auVar108._24_4_ = 0xff800000;
      auVar108._28_4_ = 0xff800000;
      auVar113 = vblendvps_avx(auVar37,auVar108,auVar113);
      local_a40 = vmaxps_avx(auVar110,auVar113);
      auVar113 = vcmpps_avx(auVar233,_local_860,6);
      auVar113 = vorps_avx(auVar284,auVar113);
      auVar109._8_4_ = 0x7f800000;
      auVar109._0_8_ = 0x7f8000007f800000;
      auVar109._12_4_ = 0x7f800000;
      auVar109._16_4_ = 0x7f800000;
      auVar109._20_4_ = 0x7f800000;
      auVar109._24_4_ = 0x7f800000;
      auVar109._28_4_ = 0x7f800000;
      auVar113 = vblendvps_avx(auVar37,auVar109,auVar113);
      local_880 = vandps_avx(auVar132,local_5c0);
      local_3c0 = vminps_avx(auVar222,auVar113);
      auVar132 = vcmpps_avx(local_a40,local_3c0,2);
      auVar113 = local_880 & auVar132;
      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0x7f,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar113 >> 0xbf,0) != '\0') ||
          (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar113[0x1f] < '\0') {
        auVar63._4_4_ = fStack_35c;
        auVar63._0_4_ = local_360;
        auVar63._8_4_ = fStack_358;
        auVar63._12_4_ = fStack_354;
        auVar63._16_4_ = uStack_350;
        auVar63._20_4_ = uStack_34c;
        auVar63._24_4_ = uStack_348;
        auVar63._28_4_ = uStack_344;
        auVar212._8_4_ = 0x3f800000;
        auVar212._0_8_ = 0x3f8000003f800000;
        auVar212._12_4_ = 0x3f800000;
        auVar212._16_4_ = 0x3f800000;
        auVar212._20_4_ = 0x3f800000;
        auVar212._24_4_ = 0x3f800000;
        auVar212._28_4_ = 0x3f800000;
        auVar113 = vminps_avx(auVar63,auVar212);
        auVar127 = ZEXT816(0) << 0x40;
        auVar222 = ZEXT1632(auVar127);
        auVar113 = vmaxps_avx(auVar113,ZEXT1632(auVar127));
        auVar62._4_4_ = fStack_37c;
        auVar62._0_4_ = local_380;
        auVar62._8_4_ = fStack_378;
        auVar62._12_4_ = fStack_374;
        auVar62._16_4_ = uStack_370;
        auVar62._20_4_ = uStack_36c;
        auVar62._24_4_ = uStack_368;
        auVar62._28_4_ = uStack_364;
        auVar284 = vminps_avx(auVar62,auVar212);
        auVar284 = vmaxps_avx(auVar284,ZEXT1632(auVar127));
        auVar38._4_4_ = (auVar113._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar113._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar113._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar113._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar113._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar113._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar113._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar113._28_4_ + 7.0;
        auVar92 = vfmadd213ps_fma(auVar38,auVar100,auVar218);
        auVar39._4_4_ = (auVar284._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar284._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar284._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar284._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar284._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar284._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar284._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar284._28_4_ + 7.0;
        auVar84 = vfmadd213ps_fma(auVar39,auVar100,auVar218);
        auVar113 = vminps_avx(auVar211,auVar230);
        auVar284 = vminps_avx(local_620,local_640);
        auVar113 = vminps_avx(auVar113,auVar284);
        auVar7 = vsubps_avx(auVar113,auVar7);
        auVar113 = vandps_avx(auVar132,local_880);
        local_1a0 = ZEXT1632(auVar92);
        local_1c0 = ZEXT1632(auVar84);
        auVar40._4_4_ = auVar7._4_4_ * 0.99999976;
        auVar40._0_4_ = auVar7._0_4_ * 0.99999976;
        auVar40._8_4_ = auVar7._8_4_ * 0.99999976;
        auVar40._12_4_ = auVar7._12_4_ * 0.99999976;
        auVar40._16_4_ = auVar7._16_4_ * 0.99999976;
        auVar40._20_4_ = auVar7._20_4_ * 0.99999976;
        auVar40._24_4_ = auVar7._24_4_ * 0.99999976;
        auVar40._28_4_ = 0x3f7ffffc;
        auVar7 = vmaxps_avx(ZEXT832(0) << 0x20,auVar40);
        auVar41._4_4_ = auVar7._4_4_ * auVar7._4_4_;
        auVar41._0_4_ = auVar7._0_4_ * auVar7._0_4_;
        auVar41._8_4_ = auVar7._8_4_ * auVar7._8_4_;
        auVar41._12_4_ = auVar7._12_4_ * auVar7._12_4_;
        auVar41._16_4_ = auVar7._16_4_ * auVar7._16_4_;
        auVar41._20_4_ = auVar7._20_4_ * auVar7._20_4_;
        auVar41._24_4_ = auVar7._24_4_ * auVar7._24_4_;
        auVar41._28_4_ = auVar7._28_4_;
        auVar7 = vsubps_avx(local_660,auVar41);
        auVar42._4_4_ = auVar7._4_4_ * fStack_29c;
        auVar42._0_4_ = auVar7._0_4_ * local_2a0;
        auVar42._8_4_ = auVar7._8_4_ * fStack_298;
        auVar42._12_4_ = auVar7._12_4_ * fStack_294;
        auVar42._16_4_ = auVar7._16_4_ * fStack_290;
        auVar42._20_4_ = auVar7._20_4_ * fStack_28c;
        auVar42._24_4_ = auVar7._24_4_ * fStack_288;
        auVar42._28_4_ = auVar132._28_4_;
        auVar284 = vsubps_avx(local_680,auVar42);
        auVar110 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_b80 = ZEXT832(0) << 0x20;
        auVar132 = vcmpps_avx(auVar284,ZEXT1632(auVar127),5);
        if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar132 >> 0x7f,0) == '\0') &&
              (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar132 >> 0xbf,0) == '\0') &&
            (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar132[0x1f]) {
          auVar133 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar274 = ZEXT864(0) << 0x20;
          auVar157 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar248._8_4_ = 0x7f800000;
          auVar248._0_8_ = 0x7f8000007f800000;
          auVar248._12_4_ = 0x7f800000;
          auVar248._16_4_ = 0x7f800000;
          auVar248._20_4_ = 0x7f800000;
          auVar248._24_4_ = 0x7f800000;
          auVar248._28_4_ = 0x7f800000;
          auVar271 = ZEXT3264(CONCAT428(0xff800000,
                                        CONCAT424(0xff800000,
                                                  CONCAT420(0xff800000,
                                                            CONCAT416(0xff800000,
                                                                      CONCAT412(0xff800000,
                                                                                CONCAT48(0xff800000,
                                                                                                                                                                                  
                                                  0xff800000ff800000)))))));
        }
        else {
          auVar110 = vrcpps_avx(auVar152);
          auVar111._8_4_ = 0x3f800000;
          auVar111._0_8_ = 0x3f8000003f800000;
          auVar111._12_4_ = 0x3f800000;
          auVar111._16_4_ = 0x3f800000;
          auVar111._20_4_ = 0x3f800000;
          auVar111._24_4_ = 0x3f800000;
          auVar111._28_4_ = 0x3f800000;
          auVar92 = vfnmadd213ps_fma(auVar152,auVar110,auVar111);
          auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar110,auVar110);
          auVar110 = vsqrtps_avx(auVar284);
          auVar240._0_8_ = local_3a0._0_8_ ^ 0x8000000080000000;
          auVar240._8_4_ = -local_3a0._8_4_;
          auVar240._12_4_ = -local_3a0._12_4_;
          auVar240._16_4_ = -local_3a0._16_4_;
          auVar240._20_4_ = -local_3a0._20_4_;
          auVar240._24_4_ = -local_3a0._24_4_;
          auVar240._28_4_ = -local_3a0._28_4_;
          auVar222 = vsubps_avx(auVar240,auVar110);
          auVar110 = vsubps_avx(auVar110,local_3a0);
          fVar184 = auVar222._0_4_ * auVar92._0_4_;
          fVar202 = auVar222._4_4_ * auVar92._4_4_;
          auVar43._4_4_ = fVar202;
          auVar43._0_4_ = fVar184;
          fVar254 = auVar222._8_4_ * auVar92._8_4_;
          auVar43._8_4_ = fVar254;
          fVar256 = auVar222._12_4_ * auVar92._12_4_;
          auVar43._12_4_ = fVar256;
          fVar235 = auVar222._16_4_ * 0.0;
          auVar43._16_4_ = fVar235;
          fVar236 = auVar222._20_4_ * 0.0;
          auVar43._20_4_ = fVar236;
          fVar237 = auVar222._24_4_ * 0.0;
          auVar43._24_4_ = fVar237;
          auVar43._28_4_ = auVar222._28_4_;
          auVar277._0_4_ = auVar110._0_4_ * auVar92._0_4_;
          auVar277._4_4_ = auVar110._4_4_ * auVar92._4_4_;
          auVar277._8_4_ = auVar110._8_4_ * auVar92._8_4_;
          auVar277._12_4_ = auVar110._12_4_ * auVar92._12_4_;
          auVar277._16_4_ = auVar110._16_4_ * 0.0;
          auVar277._20_4_ = auVar110._20_4_ * 0.0;
          auVar277._24_4_ = auVar110._24_4_ * 0.0;
          auVar277._28_4_ = 0;
          auVar92 = vfmadd213ps_fma(auVar273,auVar43,auVar197);
          auVar84 = vfmadd213ps_fma(auVar273,auVar277,auVar197);
          auVar110 = ZEXT1632(CONCAT412(fVar183 * auVar92._12_4_,
                                        CONCAT48(fVar81 * auVar92._8_4_,
                                                 CONCAT44(fVar201 * auVar92._4_4_,
                                                          fVar200 * auVar92._0_4_))));
          auVar222 = ZEXT1632(CONCAT412(auVar84._12_4_ * fVar183,
                                        CONCAT48(auVar84._8_4_ * fVar81,
                                                 CONCAT44(auVar84._4_4_ * fVar201,
                                                          auVar84._0_4_ * fVar200))));
          auVar92 = vfmadd213ps_fma(local_300,auVar110,auVar102);
          auVar84 = vfmadd213ps_fma(local_300,auVar222,auVar102);
          auVar127 = vfmadd213ps_fma(local_320,auVar110,local_2c0);
          auVar88 = vfmadd213ps_fma(local_320,auVar222,local_2c0);
          auVar83 = vfmadd213ps_fma(auVar110,local_2e0,auVar133);
          auVar126 = vfmadd213ps_fma(local_2e0,auVar222,auVar133);
          auVar44._4_4_ = fVar202 * (float)local_6a0._4_4_;
          auVar44._0_4_ = fVar184 * (float)local_6a0._0_4_;
          auVar44._8_4_ = fVar254 * fStack_698;
          auVar44._12_4_ = fVar256 * fStack_694;
          auVar44._16_4_ = fVar235 * fStack_690;
          auVar44._20_4_ = fVar236 * fStack_68c;
          auVar44._24_4_ = fVar237 * fStack_688;
          auVar44._28_4_ = 0;
          auVar110 = vsubps_avx(auVar44,ZEXT1632(auVar92));
          auVar134._0_4_ = (float)local_840._0_4_ * fVar184;
          auVar134._4_4_ = (float)local_840._4_4_ * fVar202;
          auVar134._8_4_ = fStack_838 * fVar254;
          auVar134._12_4_ = fStack_834 * fVar256;
          auVar134._16_4_ = fStack_830 * fVar235;
          auVar134._20_4_ = fStack_82c * fVar236;
          auVar134._24_4_ = fStack_828 * fVar237;
          auVar134._28_4_ = 0;
          auVar222 = vsubps_avx(auVar134,ZEXT1632(auVar127));
          auVar153._0_4_ = (float)local_820._0_4_ * fVar184;
          auVar153._4_4_ = (float)local_820._4_4_ * fVar202;
          auVar153._8_4_ = fStack_818 * fVar254;
          auVar153._12_4_ = fStack_814 * fVar256;
          auVar153._16_4_ = fStack_810 * fVar235;
          auVar153._20_4_ = fStack_80c * fVar236;
          auVar153._24_4_ = fStack_808 * fVar237;
          auVar153._28_4_ = 0;
          auVar12 = vsubps_avx(auVar153,ZEXT1632(auVar83));
          auVar157 = ZEXT3264(auVar12);
          auVar198._0_4_ = auVar277._0_4_ * (float)local_6a0._0_4_;
          auVar198._4_4_ = auVar277._4_4_ * (float)local_6a0._4_4_;
          auVar198._8_4_ = auVar277._8_4_ * fStack_698;
          auVar198._12_4_ = auVar277._12_4_ * fStack_694;
          auVar198._16_4_ = auVar277._16_4_ * fStack_690;
          auVar198._20_4_ = auVar277._20_4_ * fStack_68c;
          auVar198._24_4_ = auVar277._24_4_ * fStack_688;
          auVar198._28_4_ = 0;
          _local_b80 = vsubps_avx(auVar198,ZEXT1632(auVar84));
          auVar45._4_4_ = (float)local_840._4_4_ * auVar277._4_4_;
          auVar45._0_4_ = (float)local_840._0_4_ * auVar277._0_4_;
          auVar45._8_4_ = fStack_838 * auVar277._8_4_;
          auVar45._12_4_ = fStack_834 * auVar277._12_4_;
          auVar45._16_4_ = fStack_830 * auVar277._16_4_;
          auVar45._20_4_ = fStack_82c * auVar277._20_4_;
          auVar45._24_4_ = fStack_828 * auVar277._24_4_;
          auVar45._28_4_ = local_b80._28_4_;
          auVar133 = vsubps_avx(auVar45,ZEXT1632(auVar88));
          auVar46._4_4_ = (float)local_820._4_4_ * auVar277._4_4_;
          auVar46._0_4_ = (float)local_820._0_4_ * auVar277._0_4_;
          auVar46._8_4_ = fStack_818 * auVar277._8_4_;
          auVar46._12_4_ = fStack_814 * auVar277._12_4_;
          auVar46._16_4_ = fStack_810 * auVar277._16_4_;
          auVar46._20_4_ = fStack_80c * auVar277._20_4_;
          auVar46._24_4_ = fStack_808 * auVar277._24_4_;
          auVar46._28_4_ = uStack_824;
          auVar12 = vsubps_avx(auVar46,ZEXT1632(auVar126));
          auVar274 = ZEXT3264(auVar12);
          auVar12 = vcmpps_avx(auVar284,_DAT_01f7b000,5);
          auVar249._8_4_ = 0x7f800000;
          auVar249._0_8_ = 0x7f8000007f800000;
          auVar249._12_4_ = 0x7f800000;
          auVar249._16_4_ = 0x7f800000;
          auVar249._20_4_ = 0x7f800000;
          auVar249._24_4_ = 0x7f800000;
          auVar249._28_4_ = 0x7f800000;
          auVar248 = vblendvps_avx(auVar249,auVar43,auVar12);
          auVar284 = vandps_avx(local_8a0,auVar30);
          auVar284 = vmaxps_avx(local_5e0,auVar284);
          auVar47._4_4_ = auVar284._4_4_ * 1.9073486e-06;
          auVar47._0_4_ = auVar284._0_4_ * 1.9073486e-06;
          auVar47._8_4_ = auVar284._8_4_ * 1.9073486e-06;
          auVar47._12_4_ = auVar284._12_4_ * 1.9073486e-06;
          auVar47._16_4_ = auVar284._16_4_ * 1.9073486e-06;
          auVar47._20_4_ = auVar284._20_4_ * 1.9073486e-06;
          auVar47._24_4_ = auVar284._24_4_ * 1.9073486e-06;
          auVar47._28_4_ = auVar284._28_4_;
          auVar284 = vandps_avx(local_8a0,auVar11);
          auVar233 = vcmpps_avx(auVar284,auVar47,1);
          auVar270._8_4_ = 0xff800000;
          auVar270._0_8_ = 0xff800000ff800000;
          auVar270._12_4_ = 0xff800000;
          auVar270._16_4_ = 0xff800000;
          auVar270._20_4_ = 0xff800000;
          auVar270._24_4_ = 0xff800000;
          auVar270._28_4_ = 0xff800000;
          auVar284 = vblendvps_avx(auVar270,auVar277,auVar12);
          auVar271 = ZEXT3264(auVar284);
          auVar197 = auVar12 & auVar233;
          local_960 = auVar132;
          if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar197 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar197 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar197 >> 0x7f,0) != '\0') ||
                (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar197 >> 0xbf,0) != '\0') ||
              (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar197[0x1f] < '\0') {
            auVar132 = vandps_avx(auVar233,auVar12);
            auVar233 = vcmpps_avx(auVar7,_DAT_01f7b000,2);
            auVar214._8_4_ = 0xff800000;
            auVar214._0_8_ = 0xff800000ff800000;
            auVar214._12_4_ = 0xff800000;
            auVar214._16_4_ = 0xff800000;
            auVar214._20_4_ = 0xff800000;
            auVar214._24_4_ = 0xff800000;
            auVar214._28_4_ = 0xff800000;
            auVar223._8_4_ = 0x7f800000;
            auVar223._0_8_ = 0x7f8000007f800000;
            auVar223._12_4_ = 0x7f800000;
            auVar223._16_4_ = 0x7f800000;
            auVar223._20_4_ = 0x7f800000;
            auVar223._24_4_ = 0x7f800000;
            auVar223._28_4_ = 0x7f800000;
            auVar7 = vblendvps_avx(auVar223,auVar214,auVar233);
            auVar92 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
            auVar197 = vpmovsxwd_avx2(auVar92);
            auVar248 = vblendvps_avx(auVar248,auVar7,auVar197);
            auVar7 = vblendvps_avx(auVar214,auVar223,auVar233);
            auVar7 = vblendvps_avx(auVar284,auVar7,auVar197);
            auVar271 = ZEXT3264(auVar7);
            auVar241._0_8_ = auVar132._0_8_ ^ 0xffffffffffffffff;
            auVar241._8_4_ = auVar132._8_4_ ^ 0xffffffff;
            auVar241._12_4_ = auVar132._12_4_ ^ 0xffffffff;
            auVar241._16_4_ = auVar132._16_4_ ^ 0xffffffff;
            auVar241._20_4_ = auVar132._20_4_ ^ 0xffffffff;
            auVar241._24_4_ = auVar132._24_4_ ^ 0xffffffff;
            auVar241._28_4_ = auVar132._28_4_ ^ 0xffffffff;
            auVar132 = vorps_avx(auVar241,auVar233);
            auVar132 = vandps_avx(auVar12,auVar132);
          }
        }
        local_420 = local_a40;
        local_400 = vminps_avx(local_3c0,auVar248);
        _local_860 = vmaxps_avx(local_a40,auVar271._0_32_);
        _local_3e0 = _local_860;
        auVar7 = vcmpps_avx(local_a40,local_400,2);
        local_620 = vandps_avx(auVar7,auVar113);
        auVar7 = vcmpps_avx(_local_860,local_3c0,2);
        local_880 = vandps_avx(auVar7,auVar113);
        auVar113 = vorps_avx(local_620,local_880);
        auVar215 = ZEXT3264(_local_820);
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0x7f,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0xbf,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar113[0x1f] < '\0') {
          local_900._4_24_ = auVar228._4_24_;
          local_900._28_4_ = 0;
          auVar48._4_4_ = auVar274._4_4_ * (float)local_820._4_4_;
          auVar48._0_4_ = auVar274._0_4_ * (float)local_820._0_4_;
          auVar48._8_4_ = auVar274._8_4_ * fStack_818;
          auVar48._12_4_ = auVar274._12_4_ * fStack_814;
          auVar48._16_4_ = auVar274._16_4_ * fStack_810;
          auVar48._20_4_ = auVar274._20_4_ * fStack_80c;
          auVar48._24_4_ = auVar274._24_4_ * fStack_808;
          auVar48._28_4_ = auVar113._28_4_;
          auVar251 = ZEXT3264(_local_820);
          auVar92 = vfmadd213ps_fma(auVar133,_local_840,auVar48);
          auVar234 = ZEXT3264(_local_6a0);
          auVar92 = vfmadd213ps_fma(_local_b80,_local_6a0,ZEXT1632(auVar92));
          auVar181._0_8_ = auVar132._0_8_ ^ 0xffffffffffffffff;
          auVar181._8_4_ = auVar132._8_4_ ^ 0xffffffff;
          auVar181._12_4_ = auVar132._12_4_ ^ 0xffffffff;
          auVar181._16_4_ = auVar132._16_4_ ^ 0xffffffff;
          auVar181._20_4_ = auVar132._20_4_ ^ 0xffffffff;
          auVar181._24_4_ = auVar132._24_4_ ^ 0xffffffff;
          auVar181._28_4_ = auVar132._28_4_ ^ 0xffffffff;
          auVar271 = ZEXT3264(local_8a0);
          auVar132 = vandps_avx(local_8a0,ZEXT1632(auVar92));
          auVar213._8_4_ = 0x3e99999a;
          auVar213._0_8_ = 0x3e99999a3e99999a;
          auVar213._12_4_ = 0x3e99999a;
          auVar213._16_4_ = 0x3e99999a;
          auVar213._20_4_ = 0x3e99999a;
          auVar213._24_4_ = 0x3e99999a;
          auVar213._28_4_ = 0x3e99999a;
          auVar215 = ZEXT3264(auVar213);
          auVar132 = vcmpps_avx(auVar132,auVar213,1);
          local_660 = vorps_avx(auVar132,auVar181);
          auVar158._0_4_ = (float)local_820._0_4_ * auVar157._0_4_;
          auVar158._4_4_ = (float)local_820._4_4_ * auVar157._4_4_;
          auVar158._8_4_ = fStack_818 * auVar157._8_4_;
          auVar158._12_4_ = fStack_814 * auVar157._12_4_;
          auVar158._16_4_ = fStack_810 * auVar157._16_4_;
          auVar158._20_4_ = fStack_80c * auVar157._20_4_;
          auVar158._28_36_ = auVar157._28_36_;
          auVar158._24_4_ = fStack_808 * auVar157._24_4_;
          auVar92 = vfmadd213ps_fma(auVar222,_local_840,auVar158._0_32_);
          auVar92 = vfmadd213ps_fma(auVar110,_local_6a0,ZEXT1632(auVar92));
          auVar132 = vandps_avx(local_8a0,ZEXT1632(auVar92));
          auVar132 = vcmpps_avx(auVar132,auVar213,1);
          auVar132 = vorps_avx(auVar132,auVar181);
          auVar136._8_4_ = 3;
          auVar136._0_8_ = 0x300000003;
          auVar136._12_4_ = 3;
          auVar136._16_4_ = 3;
          auVar136._20_4_ = 3;
          auVar136._24_4_ = 3;
          auVar136._28_4_ = 3;
          auVar155._8_4_ = 2;
          auVar155._0_8_ = 0x200000002;
          auVar155._12_4_ = 2;
          auVar155._16_4_ = 2;
          auVar155._20_4_ = 2;
          auVar155._24_4_ = 2;
          auVar155._28_4_ = 2;
          auVar132 = vblendvps_avx(auVar155,auVar136,auVar132);
          local_680._4_4_ = (float)local_be8;
          local_680._0_4_ = (float)local_be8;
          local_680._8_4_ = (float)local_be8;
          local_680._12_4_ = (float)local_be8;
          local_680._16_4_ = (float)local_be8;
          local_680._20_4_ = (float)local_be8;
          local_680._24_4_ = (float)local_be8;
          local_680._28_4_ = local_be8;
          local_640 = vpcmpgtd_avx2(auVar132,local_680);
          auVar132 = vpandn_avx2(local_640,local_620);
          local_8c0._4_4_ = local_a40._4_4_ + (float)local_980._4_4_;
          local_8c0._0_4_ = local_a40._0_4_ + (float)local_980._0_4_;
          fStack_8b8 = local_a40._8_4_ + fStack_978;
          fStack_8b4 = local_a40._12_4_ + fStack_974;
          fStack_8b0 = local_a40._16_4_ + fStack_970;
          fStack_8ac = local_a40._20_4_ + fStack_96c;
          fStack_8a8 = local_a40._24_4_ + fStack_968;
          fStack_8a4 = local_a40._28_4_ + fStack_964;
          local_a20 = auVar11;
          while( true ) {
            local_440 = auVar132;
            fStack_aec = auVar9._4_4_;
            fStack_ae8 = auVar9._8_4_;
            fStack_ae4 = auVar9._12_4_;
            if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar132 >> 0x7f,0) == '\0') &&
                  (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar132 >> 0xbf,0) == '\0') &&
                (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar132[0x1f]) break;
            auVar137._8_4_ = 0x7f800000;
            auVar137._0_8_ = 0x7f8000007f800000;
            auVar137._12_4_ = 0x7f800000;
            auVar137._16_4_ = 0x7f800000;
            auVar137._20_4_ = 0x7f800000;
            auVar137._24_4_ = 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar113 = vblendvps_avx(auVar137,local_a40,auVar132);
            auVar7 = vshufps_avx(auVar113,auVar113,0xb1);
            auVar7 = vminps_avx(auVar113,auVar7);
            auVar284 = vshufpd_avx(auVar7,auVar7,5);
            auVar7 = vminps_avx(auVar7,auVar284);
            auVar284 = vpermpd_avx2(auVar7,0x4e);
            auVar7 = vminps_avx(auVar7,auVar284);
            auVar113 = vcmpps_avx(auVar113,auVar7,0);
            auVar7 = auVar132 & auVar113;
            if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar7 >> 0x7f,0) != '\0') ||
                  (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar7 >> 0xbf,0) != '\0') ||
                (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar7[0x1f] < '\0') {
              auVar132 = vandps_avx(auVar113,auVar132);
            }
            uVar70 = vmovmskps_avx(auVar132);
            iVar13 = 0;
            for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar74 = iVar13 << 2;
            *(undefined4 *)(local_440 + uVar74) = 0;
            uVar70 = *(uint *)(local_1a0 + uVar74);
            uVar74 = *(uint *)(local_420 + uVar74);
            fVar184 = auVar5._0_4_;
            if ((float)local_9a0._0_4_ < 0.0) {
              auVar271 = ZEXT1664(auVar271._0_16_);
              auVar274 = ZEXT1664(auVar274._0_16_);
              fVar184 = sqrtf((float)local_9a0._0_4_);
            }
            auVar234 = ZEXT464(uVar74);
            auVar84 = vminps_avx(auVar10,auVar85);
            auVar92 = vmaxps_avx(auVar10,auVar85);
            auVar215 = ZEXT1664(auVar9);
            auVar127 = vminps_avx(auVar8,auVar9);
            auVar88 = vminps_avx(auVar84,auVar127);
            auVar84 = vmaxps_avx(auVar8,auVar9);
            auVar127 = vmaxps_avx(auVar92,auVar84);
            auVar92 = vandps_avx(auVar88,auVar238);
            auVar84 = vandps_avx(auVar127,auVar238);
            auVar92 = vmaxps_avx(auVar92,auVar84);
            auVar84 = vmovshdup_avx(auVar92);
            auVar84 = vmaxss_avx(auVar84,auVar92);
            auVar92 = vshufpd_avx(auVar92,auVar92,1);
            auVar92 = vmaxss_avx(auVar92,auVar84);
            local_9c0 = auVar92._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar184 * 1.9073486e-06;
            local_800._0_16_ = vshufps_avx(auVar127,auVar127,0xff);
            auVar92 = vinsertps_avx(ZEXT416(uVar74),ZEXT416(uVar70),0x10);
            auVar251 = ZEXT1664(auVar92);
            lVar73 = 5;
            do {
              do {
                auVar92 = auVar251._0_16_;
                bVar78 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                if (bVar78) goto LAB_0111693b;
                local_a80 = vmovshdup_avx(auVar92);
                fVar254 = local_a80._0_4_;
                fVar81 = 1.0 - fVar254;
                fVar202 = fVar81 * fVar81 * fVar81;
                fVar201 = fVar254 * fVar254 * fVar254;
                auVar127 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar202),
                                           ZEXT416((uint)fVar201));
                fVar184 = fVar254 * fVar81;
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar184 * 6.0)),
                                          ZEXT416((uint)(fVar81 * fVar184)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar81 * fVar184 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar254 * fVar184)));
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar201),
                                          ZEXT416((uint)fVar202));
                fVar200 = (auVar84._0_4_ + auVar83._0_4_) * 0.16666667;
                fVar201 = fVar201 * 0.16666667;
                auVar128._0_4_ = fVar201 * fVar118;
                auVar128._4_4_ = fVar201 * fStack_aec;
                auVar128._8_4_ = fVar201 * fStack_ae8;
                auVar128._12_4_ = fVar201 * fStack_ae4;
                auVar164._4_4_ = fVar200;
                auVar164._0_4_ = fVar200;
                auVar164._8_4_ = fVar200;
                auVar164._12_4_ = fVar200;
                auVar84 = vfmadd132ps_fma(auVar164,auVar128,auVar8);
                fVar200 = (auVar127._0_4_ + auVar88._0_4_) * 0.16666667;
                auVar129._4_4_ = fVar200;
                auVar129._0_4_ = fVar200;
                auVar129._8_4_ = fVar200;
                auVar129._12_4_ = fVar200;
                auVar84 = vfmadd132ps_fma(auVar129,auVar84,auVar85);
                fVar201 = auVar251._0_4_;
                auVar143._4_4_ = fVar201;
                auVar143._0_4_ = fVar201;
                auVar143._8_4_ = fVar201;
                auVar143._12_4_ = fVar201;
                auVar127 = vfmadd213ps_fma(auVar143,local_990,_DAT_01f45a50);
                fVar202 = fVar202 * 0.16666667;
                auVar87._4_4_ = fVar202;
                auVar87._0_4_ = fVar202;
                auVar87._8_4_ = fVar202;
                auVar87._12_4_ = fVar202;
                auVar84 = vfmadd132ps_fma(auVar87,auVar84,auVar10);
                local_a20._0_16_ = auVar84;
                auVar127 = vsubps_avx(auVar127,auVar84);
                auVar84 = vdpps_avx(auVar127,auVar127,0x7f);
                fVar200 = auVar84._0_4_;
                if (fVar200 < 0.0) {
                  auVar234._0_4_ = sqrtf(fVar200);
                  auVar234._4_60_ = extraout_var;
                  auVar88 = auVar234._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar84,auVar84);
                }
                auVar146 = ZEXT416((uint)fVar81);
                auVar89._4_4_ = fVar81;
                auVar89._0_4_ = fVar81;
                auVar89._8_4_ = fVar81;
                auVar89._12_4_ = fVar81;
                auVar126 = vfnmsub213ss_fma(local_a80,local_a80,ZEXT416((uint)(fVar184 * 4.0)));
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar184 * 4.0)),auVar146,auVar146);
                fVar184 = fVar81 * -fVar81 * 0.5;
                fVar202 = auVar126._0_4_ * 0.5;
                fVar81 = auVar83._0_4_ * 0.5;
                fVar254 = fVar254 * fVar254 * 0.5;
                auVar207._0_4_ = fVar118 * fVar254;
                auVar207._4_4_ = fStack_aec * fVar254;
                auVar207._8_4_ = fStack_ae8 * fVar254;
                auVar207._12_4_ = fStack_ae4 * fVar254;
                auVar165._4_4_ = fVar81;
                auVar165._0_4_ = fVar81;
                auVar165._8_4_ = fVar81;
                auVar165._12_4_ = fVar81;
                auVar83 = vfmadd213ps_fma(auVar165,auVar8,auVar207);
                auVar187._4_4_ = fVar202;
                auVar187._0_4_ = fVar202;
                auVar187._8_4_ = fVar202;
                auVar187._12_4_ = fVar202;
                auVar83 = vfmadd213ps_fma(auVar187,auVar85,auVar83);
                auVar262._4_4_ = fVar184;
                auVar262._0_4_ = fVar184;
                auVar262._8_4_ = fVar184;
                auVar262._12_4_ = fVar184;
                auVar186 = vfmadd213ps_fma(auVar262,auVar10,auVar83);
                auVar126 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar146,local_a80);
                auVar146 = vfmadd213ss_fma(local_a80,SUB6416(ZEXT464(0xc0000000),0),auVar146);
                auVar83 = vshufps_avx(auVar92,auVar92,0x55);
                auVar166._0_4_ = fVar118 * auVar83._0_4_;
                auVar166._4_4_ = fStack_aec * auVar83._4_4_;
                auVar166._8_4_ = fStack_ae8 * auVar83._8_4_;
                auVar166._12_4_ = fStack_ae4 * auVar83._12_4_;
                uVar76 = auVar146._0_4_;
                auVar188._4_4_ = uVar76;
                auVar188._0_4_ = uVar76;
                auVar188._8_4_ = uVar76;
                auVar188._12_4_ = uVar76;
                auVar83 = vfmadd213ps_fma(auVar188,auVar8,auVar166);
                auVar144._0_4_ = auVar126._0_4_;
                auVar144._4_4_ = auVar144._0_4_;
                auVar144._8_4_ = auVar144._0_4_;
                auVar144._12_4_ = auVar144._0_4_;
                auVar83 = vfmadd213ps_fma(auVar144,auVar85,auVar83);
                auVar82 = vfmadd231ps_fma(auVar83,auVar10,auVar89);
                auVar126 = vdpps_avx(auVar186,auVar186,0x7f);
                auVar83 = vblendps_avx(auVar126,_DAT_01f45a50,0xe);
                auVar146 = vrsqrtss_avx(auVar83,auVar83);
                fVar184 = auVar146._0_4_;
                fVar81 = auVar126._0_4_;
                fVar184 = fVar184 * 1.5 + fVar81 * -0.5 * fVar184 * fVar184 * fVar184;
                auVar146 = vdpps_avx(auVar186,auVar82,0x7f);
                auVar145._0_4_ = auVar82._0_4_ * fVar81;
                auVar145._4_4_ = auVar82._4_4_ * fVar81;
                auVar145._8_4_ = auVar82._8_4_ * fVar81;
                auVar145._12_4_ = auVar82._12_4_ * fVar81;
                fVar202 = auVar146._0_4_;
                auVar208._0_4_ = auVar186._0_4_ * fVar202;
                auVar208._4_4_ = auVar186._4_4_ * fVar202;
                fVar254 = auVar186._8_4_;
                auVar208._8_4_ = fVar254 * fVar202;
                fVar183 = auVar186._12_4_;
                auVar208._12_4_ = fVar183 * fVar202;
                auVar146 = vsubps_avx(auVar145,auVar208);
                auVar83 = vrcpss_avx(auVar83,auVar83);
                auVar82 = vfnmadd213ss_fma(auVar83,auVar126,ZEXT416(0x40000000));
                fVar202 = auVar83._0_4_ * auVar82._0_4_;
                auVar83 = vmaxss_avx(ZEXT416((uint)local_9c0),
                                     ZEXT416((uint)(fVar201 * (float)local_960._0_4_)));
                auVar266 = ZEXT1664(auVar83);
                auVar226._0_8_ = auVar186._0_8_ ^ 0x8000000080000000;
                auVar226._8_4_ = -fVar254;
                auVar226._12_4_ = -fVar183;
                auVar167._0_4_ = fVar184 * auVar146._0_4_ * fVar202;
                auVar167._4_4_ = fVar184 * auVar146._4_4_ * fVar202;
                auVar167._8_4_ = fVar184 * auVar146._8_4_ * fVar202;
                auVar167._12_4_ = fVar184 * auVar146._12_4_ * fVar202;
                auVar245._0_4_ = auVar186._0_4_ * fVar184;
                auVar245._4_4_ = auVar186._4_4_ * fVar184;
                auVar245._8_4_ = fVar254 * fVar184;
                auVar245._12_4_ = fVar183 * fVar184;
                local_a80 = auVar186;
                if (fVar81 < -fVar81) {
                  local_9e0._0_16_ = auVar245;
                  local_a00._0_16_ = auVar167;
                  fVar184 = sqrtf(fVar81);
                  auVar266 = ZEXT464(auVar83._0_4_);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar167 = local_a00._0_16_;
                  auVar245 = local_9e0._0_16_;
                }
                else {
                  auVar126 = vsqrtss_avx(auVar126,auVar126);
                  fVar184 = auVar126._0_4_;
                }
                auVar126 = vdpps_avx(auVar127,auVar245,0x7f);
                auVar125 = vfmadd213ss_fma(ZEXT416((uint)local_9c0),auVar88,auVar266._0_16_);
                auVar146 = vdpps_avx(auVar226,auVar245,0x7f);
                auVar186 = vdpps_avx(auVar127,auVar167,0x7f);
                auVar82 = vdpps_avx(local_990,auVar245,0x7f);
                auVar125 = vfmadd213ss_fma(ZEXT416((uint)(auVar88._0_4_ + 1.0)),
                                           ZEXT416((uint)(local_9c0 / fVar184)),auVar125);
                auVar271 = ZEXT1664(auVar125);
                fVar184 = auVar146._0_4_ + auVar186._0_4_;
                auVar274 = ZEXT464((uint)fVar184);
                fVar202 = auVar126._0_4_;
                auVar90._0_4_ = fVar202 * fVar202;
                auVar90._4_4_ = auVar126._4_4_ * auVar126._4_4_;
                auVar90._8_4_ = auVar126._8_4_ * auVar126._8_4_;
                auVar90._12_4_ = auVar126._12_4_ * auVar126._12_4_;
                auVar88 = vdpps_avx(auVar127,auVar226,0x7f);
                auVar186 = vsubps_avx(auVar84,auVar90);
                auVar146 = vrsqrtss_avx(auVar186,auVar186);
                fVar81 = auVar186._0_4_;
                fVar201 = auVar146._0_4_;
                fVar201 = fVar201 * 1.5 + fVar81 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar146 = vdpps_avx(auVar127,local_990,0x7f);
                auVar88 = vfnmadd231ss_fma(auVar88,auVar126,ZEXT416((uint)fVar184));
                auVar146 = vfnmadd231ss_fma(auVar146,auVar126,auVar82);
                if (fVar81 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar184);
                  local_a00._0_16_ = auVar82;
                  local_7a0._0_16_ = auVar88;
                  local_7c0._0_4_ = fVar201;
                  local_7e0._0_16_ = auVar146;
                  fVar184 = sqrtf(fVar81);
                  auVar274 = ZEXT1664(local_9e0._0_16_);
                  auVar271 = ZEXT464(auVar125._0_4_);
                  auVar266 = ZEXT464(auVar83._0_4_);
                  fVar201 = (float)local_7c0._0_4_;
                  auVar146 = local_7e0._0_16_;
                  auVar82 = local_a00._0_16_;
                  auVar88 = local_7a0._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar186,auVar186);
                  fVar184 = auVar83._0_4_;
                }
                auVar234 = ZEXT1664(local_a80);
                auVar83 = vpermilps_avx(local_a20._0_16_,0xff);
                fVar184 = fVar184 - auVar83._0_4_;
                auVar186 = vshufps_avx(local_a80,local_a80,0xff);
                auVar88 = vfmsub213ss_fma(auVar88,ZEXT416((uint)fVar201),auVar186);
                auVar168._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar168._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar168._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar189._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                auVar189._8_4_ = auVar88._8_4_ ^ 0x80000000;
                auVar189._12_4_ = auVar88._12_4_ ^ 0x80000000;
                auVar146 = ZEXT416((uint)(auVar146._0_4_ * fVar201));
                auVar125 = auVar274._0_16_;
                auVar83 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar88._0_4_)),auVar125,
                                          auVar146);
                auVar215 = ZEXT1664(auVar83);
                auVar88 = vinsertps_avx(auVar189,auVar146,0x1c);
                uVar76 = auVar83._0_4_;
                auVar190._4_4_ = uVar76;
                auVar190._0_4_ = uVar76;
                auVar190._8_4_ = uVar76;
                auVar190._12_4_ = uVar76;
                auVar88 = vdivps_avx(auVar88,auVar190);
                auVar83 = vinsertps_avx(auVar125,auVar168,0x10);
                auVar83 = vdivps_avx(auVar83,auVar190);
                auVar147._0_4_ = fVar202 * auVar88._0_4_ + fVar184 * auVar83._0_4_;
                auVar147._4_4_ = fVar202 * auVar88._4_4_ + fVar184 * auVar83._4_4_;
                auVar147._8_4_ = fVar202 * auVar88._8_4_ + fVar184 * auVar83._8_4_;
                auVar147._12_4_ = fVar202 * auVar88._12_4_ + fVar184 * auVar83._12_4_;
                auVar88 = vsubps_avx(auVar92,auVar147);
                auVar251 = ZEXT1664(auVar88);
                auVar92 = vandps_avx(auVar126,auVar238);
              } while (auVar271._0_4_ <= auVar92._0_4_);
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar266._0_4_ + auVar271._0_4_)),
                                        local_800._0_16_,ZEXT416(0x36000000));
              auVar92 = vandps_avx(ZEXT416((uint)fVar184),auVar238);
            } while (auVar83._0_4_ <= auVar92._0_4_);
            fVar184 = auVar88._0_4_ + (float)local_930._0_4_;
            if ((fVar79 <= fVar184) &&
               (fVar201 = *(float *)(ray + k * 4 + 0x80), fVar184 <= fVar201)) {
              auVar92 = vmovshdup_avx(auVar88);
              fVar202 = auVar92._0_4_;
              if ((0.0 <= fVar202) && (fVar202 <= 1.0)) {
                auVar92 = vrsqrtss_avx(auVar84,auVar84);
                fVar81 = auVar92._0_4_;
                auVar215 = ZEXT464((uint)(fVar200 * -0.5));
                pGVar3 = (context->scene->geometries).items[uVar71].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar200 = fVar81 * 1.5 + fVar200 * -0.5 * fVar81 * fVar81 * fVar81;
                  local_b80._0_4_ = auVar127._0_4_;
                  local_b80._4_4_ = auVar127._4_4_;
                  fStack_b78 = auVar127._8_4_;
                  fStack_b74 = auVar127._12_4_;
                  auVar169._0_4_ = fVar200 * (float)local_b80._0_4_;
                  auVar169._4_4_ = fVar200 * (float)local_b80._4_4_;
                  auVar169._8_4_ = fVar200 * fStack_b78;
                  auVar169._12_4_ = fVar200 * fStack_b74;
                  auVar83 = vfmadd213ps_fma(auVar186,auVar169,local_a80);
                  auVar92 = vshufps_avx(auVar169,auVar169,0xc9);
                  auVar84 = vshufps_avx(local_a80,local_a80,0xc9);
                  auVar170._0_4_ = auVar169._0_4_ * auVar84._0_4_;
                  auVar170._4_4_ = auVar169._4_4_ * auVar84._4_4_;
                  auVar170._8_4_ = auVar169._8_4_ * auVar84._8_4_;
                  auVar170._12_4_ = auVar169._12_4_ * auVar84._12_4_;
                  auVar127 = vfmsub231ps_fma(auVar170,local_a80,auVar92);
                  auVar92 = vshufps_avx(auVar127,auVar127,0xc9);
                  auVar84 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar215 = ZEXT1664(auVar84);
                  auVar127 = vshufps_avx(auVar127,auVar127,0xd2);
                  auVar91._0_4_ = auVar83._0_4_ * auVar127._0_4_;
                  auVar91._4_4_ = auVar83._4_4_ * auVar127._4_4_;
                  auVar91._8_4_ = auVar83._8_4_ * auVar127._8_4_;
                  auVar91._12_4_ = auVar83._12_4_ * auVar127._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar91,auVar92,auVar84);
                  uVar76 = auVar92._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar184;
                    uVar2 = vextractps_avx(auVar92,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                    uVar2 = vextractps_avx(auVar92,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar76;
                    *(float *)(ray + k * 4 + 0xf0) = fVar202;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x110) = local_900._0_4_;
                    *(uint *)(ray + k * 4 + 0x120) = uVar71;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_730 = vshufps_avx(auVar88,auVar88,0x55);
                    auVar127 = vshufps_avx(auVar92,auVar92,0x55);
                    auStack_750 = vshufps_avx(auVar92,auVar92,0xaa);
                    local_760 = (RTCHitN  [16])auVar127;
                    local_740 = uVar76;
                    uStack_73c = uVar76;
                    uStack_738 = uVar76;
                    uStack_734 = uVar76;
                    local_720 = ZEXT416(0) << 0x20;
                    local_710 = CONCAT44(uStack_77c,local_780);
                    uStack_708 = CONCAT44(uStack_774,uStack_778);
                    local_700._4_4_ = uStack_76c;
                    local_700._0_4_ = local_770;
                    local_700._8_4_ = uStack_768;
                    local_700._12_4_ = uStack_764;
                    vpcmpeqd_avx2(ZEXT1632(local_700),ZEXT1632(local_700));
                    uStack_6ec = context->user->instID[0];
                    local_6f0 = uStack_6ec;
                    uStack_6e8 = uStack_6ec;
                    uStack_6e4 = uStack_6ec;
                    uStack_6e0 = context->user->instPrimID[0];
                    uStack_6dc = uStack_6e0;
                    uStack_6d8 = uStack_6e0;
                    uStack_6d4 = uStack_6e0;
                    *(float *)(ray + k * 4 + 0x80) = fVar184;
                    local_8e0._0_16_ = *local_a48;
                    local_ab0.valid = (int *)local_8e0;
                    local_ab0.geometryUserPtr = pGVar3->userPtr;
                    local_ab0.context = context->user;
                    local_ab0.hit = local_760;
                    local_ab0.N = 4;
                    auVar92 = *local_a48;
                    local_ab0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar215 = ZEXT1664(auVar84);
                      auVar234 = ZEXT1664(local_a80);
                      auVar251 = ZEXT1664(auVar88);
                      auVar271 = ZEXT1664(auVar271._0_16_);
                      auVar274 = ZEXT1664(auVar125);
                      (*pGVar3->intersectionFilterN)(&local_ab0);
                      auVar92 = local_8e0._0_16_;
                    }
                    if (auVar92 == (undefined1  [16])0x0) {
                      auVar84 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar84 = auVar84 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar215 = ZEXT1664(auVar215._0_16_);
                        auVar234 = ZEXT1664(auVar234._0_16_);
                        auVar251 = ZEXT1664(auVar251._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        auVar274 = ZEXT1664(auVar274._0_16_);
                        (*p_Var4)(&local_ab0);
                        auVar92 = local_8e0._0_16_;
                      }
                      auVar88 = vpcmpeqd_avx(auVar92,_DAT_01f45a50);
                      auVar127 = vpcmpeqd_avx(auVar127,auVar127);
                      auVar84 = auVar88 ^ auVar127;
                      if (auVar92 != (undefined1  [16])0x0) {
                        auVar88 = auVar88 ^ auVar127;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])local_ab0.hit);
                        *(undefined1 (*) [16])(local_ab0.ray + 0xc0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x10));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xd0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x20));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xe0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x30));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xf0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x40));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x100) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x50));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x110) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x60));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x120) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x70));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x130) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x80));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x140) = auVar92;
                      }
                    }
                    auVar93._8_8_ = 0x100000001;
                    auVar93._0_8_ = 0x100000001;
                    if ((auVar93 & auVar84) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar201;
                    }
                  }
                }
              }
            }
LAB_0111693b:
            uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar264._4_4_ = uVar76;
            auVar264._0_4_ = uVar76;
            auVar264._8_4_ = uVar76;
            auVar264._12_4_ = uVar76;
            auVar264._16_4_ = uVar76;
            auVar264._20_4_ = uVar76;
            auVar264._24_4_ = uVar76;
            auVar264._28_4_ = uVar76;
            auVar266 = ZEXT3264(auVar264);
            auVar132 = vcmpps_avx(_local_8c0,auVar264,2);
            auVar132 = vandps_avx(auVar132,local_440);
          }
          auVar115._0_4_ = (float)local_980._0_4_ + (float)local_860._0_4_;
          auVar115._4_4_ = (float)local_980._4_4_ + (float)local_860._4_4_;
          auVar115._8_4_ = fStack_978 + fStack_858;
          auVar115._12_4_ = fStack_974 + fStack_854;
          auVar115._16_4_ = fStack_970 + fStack_850;
          auVar115._20_4_ = fStack_96c + fStack_84c;
          auVar115._24_4_ = fStack_968 + fStack_848;
          auVar115._28_4_ = fStack_964 + fStack_844;
          uVar76 = auVar266._0_4_;
          auVar138._4_4_ = uVar76;
          auVar138._0_4_ = uVar76;
          auVar138._8_4_ = uVar76;
          auVar138._12_4_ = uVar76;
          auVar138._16_4_ = uVar76;
          auVar138._20_4_ = uVar76;
          auVar138._24_4_ = uVar76;
          auVar138._28_4_ = uVar76;
          auVar132 = vcmpps_avx(auVar115,auVar138,2);
          local_880 = vandps_avx(auVar132,local_880);
          auVar116._8_4_ = 3;
          auVar116._0_8_ = 0x300000003;
          auVar116._12_4_ = 3;
          auVar116._16_4_ = 3;
          auVar116._20_4_ = 3;
          auVar116._24_4_ = 3;
          auVar116._28_4_ = 3;
          auVar139._8_4_ = 2;
          auVar139._0_8_ = 0x200000002;
          auVar139._12_4_ = 2;
          auVar139._16_4_ = 2;
          auVar139._20_4_ = 2;
          auVar139._24_4_ = 2;
          auVar139._28_4_ = 2;
          auVar132 = vblendvps_avx(auVar139,auVar116,local_660);
          _local_8c0 = vpcmpgtd_avx2(auVar132,local_680);
          local_8e0 = vpandn_avx2(_local_8c0,local_880);
          local_a40 = _local_3e0;
          local_860._4_4_ = (float)local_980._4_4_ + (float)local_3e0._4_4_;
          local_860._0_4_ = (float)local_980._0_4_ + (float)local_3e0._0_4_;
          fStack_858 = fStack_978 + fStack_3d8;
          fStack_854 = fStack_974 + fStack_3d4;
          fStack_850 = fStack_970 + fStack_3d0;
          fStack_84c = fStack_96c + fStack_3cc;
          fStack_848 = fStack_968 + fStack_3c8;
          fStack_844 = fStack_964 + fStack_3c4;
          for (; (((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_8e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_8e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_8e0 >> 0x7f,0) != '\0') ||
                   (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_8e0 >> 0xbf,0) != '\0') ||
                 (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_8e0[0x1f] < '\0'; local_8e0 = vandps_avx(auVar132,local_8e0)) {
            auVar140._8_4_ = 0x7f800000;
            auVar140._0_8_ = 0x7f8000007f800000;
            auVar140._12_4_ = 0x7f800000;
            auVar140._16_4_ = 0x7f800000;
            auVar140._20_4_ = 0x7f800000;
            auVar140._24_4_ = 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar132 = vblendvps_avx(auVar140,local_a40,local_8e0);
            auVar113 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar113 = vminps_avx(auVar132,auVar113);
            auVar7 = vshufpd_avx(auVar113,auVar113,5);
            auVar113 = vminps_avx(auVar113,auVar7);
            auVar7 = vpermpd_avx2(auVar113,0x4e);
            auVar113 = vminps_avx(auVar113,auVar7);
            auVar113 = vcmpps_avx(auVar132,auVar113,0);
            auVar7 = local_8e0 & auVar113;
            auVar132 = local_8e0;
            if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar7 >> 0x7f,0) != '\0') ||
                  (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar7 >> 0xbf,0) != '\0') ||
                (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar7[0x1f] < '\0') {
              auVar132 = vandps_avx(auVar113,local_8e0);
            }
            uVar70 = vmovmskps_avx(auVar132);
            iVar13 = 0;
            for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar74 = iVar13 << 2;
            *(undefined4 *)(local_8e0 + uVar74) = 0;
            uVar70 = *(uint *)(local_1c0 + uVar74);
            uVar74 = *(uint *)(local_3c0 + uVar74);
            fVar184 = auVar6._0_4_;
            if ((float)local_9a0._0_4_ < 0.0) {
              auVar271 = ZEXT1664(auVar271._0_16_);
              auVar274 = ZEXT1664(auVar274._0_16_);
              fVar184 = sqrtf((float)local_9a0._0_4_);
            }
            auVar234 = ZEXT464(uVar74);
            auVar84 = vminps_avx(auVar10,auVar85);
            auVar92 = vmaxps_avx(auVar10,auVar85);
            auVar215 = ZEXT1664(auVar9);
            auVar127 = vminps_avx(auVar8,auVar9);
            auVar88 = vminps_avx(auVar84,auVar127);
            auVar84 = vmaxps_avx(auVar8,auVar9);
            auVar127 = vmaxps_avx(auVar92,auVar84);
            auVar92 = vandps_avx(auVar88,auVar238);
            auVar84 = vandps_avx(auVar127,auVar238);
            auVar92 = vmaxps_avx(auVar92,auVar84);
            auVar84 = vmovshdup_avx(auVar92);
            auVar84 = vmaxss_avx(auVar84,auVar92);
            auVar92 = vshufpd_avx(auVar92,auVar92,1);
            auVar92 = vmaxss_avx(auVar92,auVar84);
            local_9c0 = auVar92._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar184 * 1.9073486e-06;
            local_800._0_16_ = vshufps_avx(auVar127,auVar127,0xff);
            auVar92 = vinsertps_avx(ZEXT416(uVar74),ZEXT416(uVar70),0x10);
            auVar251 = ZEXT1664(auVar92);
            lVar73 = 5;
            do {
              do {
                auVar92 = auVar251._0_16_;
                bVar78 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                if (bVar78) goto LAB_01117459;
                local_a80 = vmovshdup_avx(auVar92);
                fVar254 = local_a80._0_4_;
                fVar81 = 1.0 - fVar254;
                fVar202 = fVar81 * fVar81 * fVar81;
                fVar201 = fVar254 * fVar254 * fVar254;
                auVar127 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar202),
                                           ZEXT416((uint)fVar201));
                fVar184 = fVar254 * fVar81;
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar184 * 6.0)),
                                          ZEXT416((uint)(fVar81 * fVar184)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar81 * fVar184 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar254 * fVar184)));
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar201),
                                          ZEXT416((uint)fVar202));
                fVar200 = (auVar84._0_4_ + auVar83._0_4_) * 0.16666667;
                fVar201 = fVar201 * 0.16666667;
                auVar130._0_4_ = fVar201 * fVar118;
                auVar130._4_4_ = fVar201 * fStack_aec;
                auVar130._8_4_ = fVar201 * fStack_ae8;
                auVar130._12_4_ = fVar201 * fStack_ae4;
                auVar171._4_4_ = fVar200;
                auVar171._0_4_ = fVar200;
                auVar171._8_4_ = fVar200;
                auVar171._12_4_ = fVar200;
                auVar84 = vfmadd132ps_fma(auVar171,auVar130,auVar8);
                fVar200 = (auVar127._0_4_ + auVar88._0_4_) * 0.16666667;
                auVar131._4_4_ = fVar200;
                auVar131._0_4_ = fVar200;
                auVar131._8_4_ = fVar200;
                auVar131._12_4_ = fVar200;
                auVar84 = vfmadd132ps_fma(auVar131,auVar84,auVar85);
                fVar201 = auVar251._0_4_;
                auVar148._4_4_ = fVar201;
                auVar148._0_4_ = fVar201;
                auVar148._8_4_ = fVar201;
                auVar148._12_4_ = fVar201;
                auVar127 = vfmadd213ps_fma(auVar148,local_990,_DAT_01f45a50);
                fVar202 = fVar202 * 0.16666667;
                auVar94._4_4_ = fVar202;
                auVar94._0_4_ = fVar202;
                auVar94._8_4_ = fVar202;
                auVar94._12_4_ = fVar202;
                auVar84 = vfmadd132ps_fma(auVar94,auVar84,auVar10);
                local_a20._0_16_ = auVar84;
                auVar127 = vsubps_avx(auVar127,auVar84);
                auVar84 = vdpps_avx(auVar127,auVar127,0x7f);
                fVar200 = auVar84._0_4_;
                if (fVar200 < 0.0) {
                  auVar215._0_4_ = sqrtf(fVar200);
                  auVar215._4_60_ = extraout_var_00;
                  auVar88 = auVar215._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar84,auVar84);
                }
                auVar146 = ZEXT416((uint)fVar81);
                auVar95._4_4_ = fVar81;
                auVar95._0_4_ = fVar81;
                auVar95._8_4_ = fVar81;
                auVar95._12_4_ = fVar81;
                auVar126 = vfnmsub213ss_fma(local_a80,local_a80,ZEXT416((uint)(fVar184 * 4.0)));
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar184 * 4.0)),auVar146,auVar146);
                fVar184 = fVar81 * -fVar81 * 0.5;
                fVar202 = auVar126._0_4_ * 0.5;
                fVar81 = auVar83._0_4_ * 0.5;
                fVar254 = fVar254 * fVar254 * 0.5;
                auVar209._0_4_ = fVar118 * fVar254;
                auVar209._4_4_ = fStack_aec * fVar254;
                auVar209._8_4_ = fStack_ae8 * fVar254;
                auVar209._12_4_ = fStack_ae4 * fVar254;
                auVar172._4_4_ = fVar81;
                auVar172._0_4_ = fVar81;
                auVar172._8_4_ = fVar81;
                auVar172._12_4_ = fVar81;
                auVar83 = vfmadd213ps_fma(auVar172,auVar8,auVar209);
                auVar191._4_4_ = fVar202;
                auVar191._0_4_ = fVar202;
                auVar191._8_4_ = fVar202;
                auVar191._12_4_ = fVar202;
                auVar83 = vfmadd213ps_fma(auVar191,auVar85,auVar83);
                auVar263._4_4_ = fVar184;
                auVar263._0_4_ = fVar184;
                auVar263._8_4_ = fVar184;
                auVar263._12_4_ = fVar184;
                auVar186 = vfmadd213ps_fma(auVar263,auVar10,auVar83);
                auVar126 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar146,local_a80);
                auVar146 = vfmadd213ss_fma(local_a80,SUB6416(ZEXT464(0xc0000000),0),auVar146);
                auVar83 = vshufps_avx(auVar92,auVar92,0x55);
                auVar173._0_4_ = fVar118 * auVar83._0_4_;
                auVar173._4_4_ = fStack_aec * auVar83._4_4_;
                auVar173._8_4_ = fStack_ae8 * auVar83._8_4_;
                auVar173._12_4_ = fStack_ae4 * auVar83._12_4_;
                uVar76 = auVar146._0_4_;
                auVar192._4_4_ = uVar76;
                auVar192._0_4_ = uVar76;
                auVar192._8_4_ = uVar76;
                auVar192._12_4_ = uVar76;
                auVar83 = vfmadd213ps_fma(auVar192,auVar8,auVar173);
                auVar149._0_4_ = auVar126._0_4_;
                auVar149._4_4_ = auVar149._0_4_;
                auVar149._8_4_ = auVar149._0_4_;
                auVar149._12_4_ = auVar149._0_4_;
                auVar83 = vfmadd213ps_fma(auVar149,auVar85,auVar83);
                auVar82 = vfmadd231ps_fma(auVar83,auVar10,auVar95);
                auVar126 = vdpps_avx(auVar186,auVar186,0x7f);
                auVar83 = vblendps_avx(auVar126,_DAT_01f45a50,0xe);
                auVar146 = vrsqrtss_avx(auVar83,auVar83);
                fVar184 = auVar146._0_4_;
                fVar81 = auVar126._0_4_;
                fVar184 = fVar184 * 1.5 + fVar81 * -0.5 * fVar184 * fVar184 * fVar184;
                auVar146 = vdpps_avx(auVar186,auVar82,0x7f);
                auVar150._0_4_ = auVar82._0_4_ * fVar81;
                auVar150._4_4_ = auVar82._4_4_ * fVar81;
                auVar150._8_4_ = auVar82._8_4_ * fVar81;
                auVar150._12_4_ = auVar82._12_4_ * fVar81;
                fVar202 = auVar146._0_4_;
                auVar210._0_4_ = auVar186._0_4_ * fVar202;
                auVar210._4_4_ = auVar186._4_4_ * fVar202;
                fVar254 = auVar186._8_4_;
                auVar210._8_4_ = fVar254 * fVar202;
                fVar183 = auVar186._12_4_;
                auVar210._12_4_ = fVar183 * fVar202;
                auVar146 = vsubps_avx(auVar150,auVar210);
                auVar83 = vrcpss_avx(auVar83,auVar83);
                auVar82 = vfnmadd213ss_fma(auVar83,auVar126,ZEXT416(0x40000000));
                fVar202 = auVar83._0_4_ * auVar82._0_4_;
                auVar83 = vmaxss_avx(ZEXT416((uint)local_9c0),
                                     ZEXT416((uint)(fVar201 * (float)local_960._0_4_)));
                auVar266 = ZEXT1664(auVar83);
                auVar227._0_8_ = auVar186._0_8_ ^ 0x8000000080000000;
                auVar227._8_4_ = -fVar254;
                auVar227._12_4_ = -fVar183;
                auVar174._0_4_ = fVar184 * auVar146._0_4_ * fVar202;
                auVar174._4_4_ = fVar184 * auVar146._4_4_ * fVar202;
                auVar174._8_4_ = fVar184 * auVar146._8_4_ * fVar202;
                auVar174._12_4_ = fVar184 * auVar146._12_4_ * fVar202;
                auVar246._0_4_ = auVar186._0_4_ * fVar184;
                auVar246._4_4_ = auVar186._4_4_ * fVar184;
                auVar246._8_4_ = fVar254 * fVar184;
                auVar246._12_4_ = fVar183 * fVar184;
                local_a80 = auVar186;
                if (fVar81 < -fVar81) {
                  local_9e0._0_16_ = auVar246;
                  local_a00._0_16_ = auVar174;
                  fVar184 = sqrtf(fVar81);
                  auVar266 = ZEXT464(auVar83._0_4_);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar174 = local_a00._0_16_;
                  auVar246 = local_9e0._0_16_;
                }
                else {
                  auVar126 = vsqrtss_avx(auVar126,auVar126);
                  fVar184 = auVar126._0_4_;
                }
                auVar126 = vdpps_avx(auVar127,auVar246,0x7f);
                auVar125 = vfmadd213ss_fma(ZEXT416((uint)local_9c0),auVar88,auVar266._0_16_);
                auVar146 = vdpps_avx(auVar227,auVar246,0x7f);
                auVar186 = vdpps_avx(auVar127,auVar174,0x7f);
                auVar82 = vdpps_avx(local_990,auVar246,0x7f);
                auVar125 = vfmadd213ss_fma(ZEXT416((uint)(auVar88._0_4_ + 1.0)),
                                           ZEXT416((uint)(local_9c0 / fVar184)),auVar125);
                auVar271 = ZEXT1664(auVar125);
                fVar184 = auVar146._0_4_ + auVar186._0_4_;
                auVar274 = ZEXT464((uint)fVar184);
                fVar202 = auVar126._0_4_;
                auVar96._0_4_ = fVar202 * fVar202;
                auVar96._4_4_ = auVar126._4_4_ * auVar126._4_4_;
                auVar96._8_4_ = auVar126._8_4_ * auVar126._8_4_;
                auVar96._12_4_ = auVar126._12_4_ * auVar126._12_4_;
                auVar88 = vdpps_avx(auVar127,auVar227,0x7f);
                auVar186 = vsubps_avx(auVar84,auVar96);
                auVar146 = vrsqrtss_avx(auVar186,auVar186);
                fVar81 = auVar186._0_4_;
                fVar201 = auVar146._0_4_;
                fVar201 = fVar201 * 1.5 + fVar81 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar146 = vdpps_avx(auVar127,local_990,0x7f);
                auVar88 = vfnmadd231ss_fma(auVar88,auVar126,ZEXT416((uint)fVar184));
                auVar146 = vfnmadd231ss_fma(auVar146,auVar126,auVar82);
                if (fVar81 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar184);
                  local_a00._0_16_ = auVar82;
                  local_7a0._0_16_ = auVar88;
                  local_7c0._0_4_ = fVar201;
                  local_7e0._0_16_ = auVar146;
                  fVar184 = sqrtf(fVar81);
                  auVar274 = ZEXT1664(local_9e0._0_16_);
                  auVar271 = ZEXT464(auVar125._0_4_);
                  auVar266 = ZEXT464(auVar83._0_4_);
                  fVar201 = (float)local_7c0._0_4_;
                  auVar146 = local_7e0._0_16_;
                  auVar82 = local_a00._0_16_;
                  auVar88 = local_7a0._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar186,auVar186);
                  fVar184 = auVar83._0_4_;
                }
                auVar234 = ZEXT1664(local_a80);
                auVar83 = vpermilps_avx(local_a20._0_16_,0xff);
                fVar184 = fVar184 - auVar83._0_4_;
                auVar186 = vshufps_avx(local_a80,local_a80,0xff);
                auVar88 = vfmsub213ss_fma(auVar88,ZEXT416((uint)fVar201),auVar186);
                auVar175._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar175._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar175._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar193._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                auVar193._8_4_ = auVar88._8_4_ ^ 0x80000000;
                auVar193._12_4_ = auVar88._12_4_ ^ 0x80000000;
                auVar146 = ZEXT416((uint)(auVar146._0_4_ * fVar201));
                auVar125 = auVar274._0_16_;
                auVar83 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar88._0_4_)),auVar125,
                                          auVar146);
                auVar215 = ZEXT1664(auVar83);
                auVar88 = vinsertps_avx(auVar193,auVar146,0x1c);
                uVar76 = auVar83._0_4_;
                auVar194._4_4_ = uVar76;
                auVar194._0_4_ = uVar76;
                auVar194._8_4_ = uVar76;
                auVar194._12_4_ = uVar76;
                auVar88 = vdivps_avx(auVar88,auVar194);
                auVar83 = vinsertps_avx(auVar125,auVar175,0x10);
                auVar83 = vdivps_avx(auVar83,auVar194);
                auVar151._0_4_ = fVar202 * auVar88._0_4_ + fVar184 * auVar83._0_4_;
                auVar151._4_4_ = fVar202 * auVar88._4_4_ + fVar184 * auVar83._4_4_;
                auVar151._8_4_ = fVar202 * auVar88._8_4_ + fVar184 * auVar83._8_4_;
                auVar151._12_4_ = fVar202 * auVar88._12_4_ + fVar184 * auVar83._12_4_;
                auVar88 = vsubps_avx(auVar92,auVar151);
                auVar251 = ZEXT1664(auVar88);
                auVar92 = vandps_avx(auVar126,auVar238);
              } while (auVar271._0_4_ <= auVar92._0_4_);
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar266._0_4_ + auVar271._0_4_)),
                                        local_800._0_16_,ZEXT416(0x36000000));
              auVar92 = vandps_avx(ZEXT416((uint)fVar184),auVar238);
            } while (auVar83._0_4_ <= auVar92._0_4_);
            fVar184 = auVar88._0_4_ + (float)local_930._0_4_;
            if ((fVar79 <= fVar184) &&
               (fVar201 = *(float *)(ray + k * 4 + 0x80), fVar184 <= fVar201)) {
              auVar92 = vmovshdup_avx(auVar88);
              fVar202 = auVar92._0_4_;
              if ((0.0 <= fVar202) && (fVar202 <= 1.0)) {
                auVar92 = vrsqrtss_avx(auVar84,auVar84);
                fVar81 = auVar92._0_4_;
                auVar215 = ZEXT464((uint)(fVar200 * -0.5));
                pGVar3 = (context->scene->geometries).items[uVar71].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar200 = fVar81 * 1.5 + fVar200 * -0.5 * fVar81 * fVar81 * fVar81;
                  local_b80._0_4_ = auVar127._0_4_;
                  local_b80._4_4_ = auVar127._4_4_;
                  fStack_b78 = auVar127._8_4_;
                  fStack_b74 = auVar127._12_4_;
                  auVar176._0_4_ = fVar200 * (float)local_b80._0_4_;
                  auVar176._4_4_ = fVar200 * (float)local_b80._4_4_;
                  auVar176._8_4_ = fVar200 * fStack_b78;
                  auVar176._12_4_ = fVar200 * fStack_b74;
                  auVar83 = vfmadd213ps_fma(auVar186,auVar176,local_a80);
                  auVar92 = vshufps_avx(auVar176,auVar176,0xc9);
                  auVar84 = vshufps_avx(local_a80,local_a80,0xc9);
                  auVar177._0_4_ = auVar176._0_4_ * auVar84._0_4_;
                  auVar177._4_4_ = auVar176._4_4_ * auVar84._4_4_;
                  auVar177._8_4_ = auVar176._8_4_ * auVar84._8_4_;
                  auVar177._12_4_ = auVar176._12_4_ * auVar84._12_4_;
                  auVar127 = vfmsub231ps_fma(auVar177,local_a80,auVar92);
                  auVar92 = vshufps_avx(auVar127,auVar127,0xc9);
                  auVar84 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar215 = ZEXT1664(auVar84);
                  auVar127 = vshufps_avx(auVar127,auVar127,0xd2);
                  auVar97._0_4_ = auVar83._0_4_ * auVar127._0_4_;
                  auVar97._4_4_ = auVar83._4_4_ * auVar127._4_4_;
                  auVar97._8_4_ = auVar83._8_4_ * auVar127._8_4_;
                  auVar97._12_4_ = auVar83._12_4_ * auVar127._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar97,auVar92,auVar84);
                  uVar76 = auVar92._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar184;
                    uVar2 = vextractps_avx(auVar92,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                    uVar2 = vextractps_avx(auVar92,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar76;
                    *(float *)(ray + k * 4 + 0xf0) = fVar202;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x110) = local_900._0_4_;
                    *(uint *)(ray + k * 4 + 0x120) = uVar71;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_730 = vshufps_avx(auVar88,auVar88,0x55);
                    auVar127 = vshufps_avx(auVar92,auVar92,0x55);
                    auStack_750 = vshufps_avx(auVar92,auVar92,0xaa);
                    local_760 = (RTCHitN  [16])auVar127;
                    local_740 = uVar76;
                    uStack_73c = uVar76;
                    uStack_738 = uVar76;
                    uStack_734 = uVar76;
                    local_720 = ZEXT416(0) << 0x20;
                    local_710 = CONCAT44(uStack_77c,local_780);
                    uStack_708 = CONCAT44(uStack_774,uStack_778);
                    local_700._4_4_ = uStack_76c;
                    local_700._0_4_ = local_770;
                    local_700._8_4_ = uStack_768;
                    local_700._12_4_ = uStack_764;
                    vpcmpeqd_avx2(ZEXT1632(local_700),ZEXT1632(local_700));
                    uStack_6ec = context->user->instID[0];
                    local_6f0 = uStack_6ec;
                    uStack_6e8 = uStack_6ec;
                    uStack_6e4 = uStack_6ec;
                    uStack_6e0 = context->user->instPrimID[0];
                    uStack_6dc = uStack_6e0;
                    uStack_6d8 = uStack_6e0;
                    uStack_6d4 = uStack_6e0;
                    *(float *)(ray + k * 4 + 0x80) = fVar184;
                    local_920 = *local_a48;
                    local_ab0.valid = (int *)local_920;
                    local_ab0.geometryUserPtr = pGVar3->userPtr;
                    local_ab0.context = context->user;
                    local_ab0.hit = local_760;
                    local_ab0.N = 4;
                    local_ab0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar215 = ZEXT1664(auVar84);
                      auVar234 = ZEXT1664(local_a80);
                      auVar251 = ZEXT1664(auVar88);
                      auVar271 = ZEXT1664(auVar271._0_16_);
                      auVar274 = ZEXT1664(auVar125);
                      (*pGVar3->intersectionFilterN)(&local_ab0);
                    }
                    if (local_920 == (undefined1  [16])0x0) {
                      auVar92 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar92 = auVar92 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar215 = ZEXT1664(auVar215._0_16_);
                        auVar234 = ZEXT1664(auVar234._0_16_);
                        auVar251 = ZEXT1664(auVar251._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        auVar274 = ZEXT1664(auVar274._0_16_);
                        (*p_Var4)(&local_ab0);
                      }
                      auVar84 = vpcmpeqd_avx(local_920,_DAT_01f45a50);
                      auVar127 = vpcmpeqd_avx(auVar127,auVar127);
                      auVar92 = auVar84 ^ auVar127;
                      if (local_920 != (undefined1  [16])0x0) {
                        auVar84 = auVar84 ^ auVar127;
                        auVar127 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])local_ab0.hit);
                        *(undefined1 (*) [16])(local_ab0.ray + 0xc0) = auVar127;
                        auVar127 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x10));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xd0) = auVar127;
                        auVar127 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x20));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xe0) = auVar127;
                        auVar127 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x30));
                        *(undefined1 (*) [16])(local_ab0.ray + 0xf0) = auVar127;
                        auVar127 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x40));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x100) = auVar127;
                        auVar127 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x50));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x110) = auVar127;
                        auVar127 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x60));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x120) = auVar127;
                        auVar127 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])
                                                           (local_ab0.hit + 0x70));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x130) = auVar127;
                        auVar84 = vmaskmovps_avx(auVar84,*(undefined1 (*) [16])
                                                          (local_ab0.hit + 0x80));
                        *(undefined1 (*) [16])(local_ab0.ray + 0x140) = auVar84;
                      }
                    }
                    auVar98._8_8_ = 0x100000001;
                    auVar98._0_8_ = 0x100000001;
                    if ((auVar98 & auVar92) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar201;
                    }
                  }
                }
              }
            }
LAB_01117459:
            uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar265._4_4_ = uVar76;
            auVar265._0_4_ = uVar76;
            auVar265._8_4_ = uVar76;
            auVar265._12_4_ = uVar76;
            auVar265._16_4_ = uVar76;
            auVar265._20_4_ = uVar76;
            auVar265._24_4_ = uVar76;
            auVar265._28_4_ = uVar76;
            auVar266 = ZEXT3264(auVar265);
            auVar132 = vcmpps_avx(_local_860,auVar265,2);
          }
          auVar141._0_4_ = local_980._0_4_ + local_420._0_4_;
          auVar141._4_4_ = local_980._4_4_ + local_420._4_4_;
          auVar141._8_4_ = local_980._8_4_ + local_420._8_4_;
          auVar141._12_4_ = local_980._12_4_ + local_420._12_4_;
          auVar141._16_4_ = local_980._16_4_ + local_420._16_4_;
          auVar141._20_4_ = local_980._20_4_ + local_420._20_4_;
          auVar141._24_4_ = local_980._24_4_ + local_420._24_4_;
          auVar141._28_4_ = local_980._28_4_ + local_420._28_4_;
          uVar76 = auVar266._0_4_;
          auVar182._4_4_ = uVar76;
          auVar182._0_4_ = uVar76;
          auVar182._8_4_ = uVar76;
          auVar182._12_4_ = uVar76;
          auVar182._16_4_ = uVar76;
          auVar182._20_4_ = uVar76;
          auVar182._24_4_ = uVar76;
          auVar182._28_4_ = uVar76;
          auVar266 = ZEXT3264(_local_980);
          auVar113 = vcmpps_avx(auVar141,auVar182,2);
          auVar132 = vandps_avx(local_640,local_620);
          auVar132 = vandps_avx(auVar113,auVar132);
          auVar199._0_4_ = local_980._0_4_ + local_3e0._0_4_;
          auVar199._4_4_ = local_980._4_4_ + local_3e0._4_4_;
          auVar199._8_4_ = local_980._8_4_ + local_3e0._8_4_;
          auVar199._12_4_ = local_980._12_4_ + local_3e0._12_4_;
          auVar199._16_4_ = local_980._16_4_ + local_3e0._16_4_;
          auVar199._20_4_ = local_980._20_4_ + local_3e0._20_4_;
          auVar199._24_4_ = local_980._24_4_ + local_3e0._24_4_;
          auVar199._28_4_ = local_980._28_4_ + local_3e0._28_4_;
          auVar7 = vcmpps_avx(auVar199,auVar182,2);
          auVar113 = vandps_avx(_local_8c0,local_880);
          auVar113 = vandps_avx(auVar7,auVar113);
          auVar113 = vorps_avx(auVar132,auVar113);
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar113 >> 0x7f,0) != '\0') ||
                (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0xbf,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar113[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar72 * 0x60) = auVar113;
            auVar132 = vblendvps_avx(_local_3e0,local_420,auVar132);
            *(undefined1 (*) [32])(auStack_160 + uVar72 * 0x60) = auVar132;
            uVar14 = vmovlps_avx(local_5f0);
            (&uStack_140)[uVar72 * 0xc] = uVar14;
            aiStack_138[uVar72 * 0x18] = local_be8 + 1;
            uVar72 = (ulong)((int)uVar72 + 1);
          }
          goto LAB_01115f1d;
        }
      }
      auVar251 = ZEXT3264(_local_860);
      auVar234 = ZEXT3264(local_880);
      auVar266 = ZEXT3264(_local_980);
    }
LAB_01115f1d:
    while( true ) {
      uVar70 = (uint)uVar72;
      if (uVar70 == 0) {
        uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar99._4_4_ = uVar76;
        auVar99._0_4_ = uVar76;
        auVar99._8_4_ = uVar76;
        auVar99._12_4_ = uVar76;
        auVar5 = vcmpps_avx(local_600,auVar99,2);
        uVar71 = vmovmskps_avx(auVar5);
        uVar77 = (ulong)((uint)uVar77 & uVar71);
        goto LAB_01114fd5;
      }
      uVar72 = (ulong)(uVar70 - 1);
      lVar73 = uVar72 * 0x60;
      auVar132 = *(undefined1 (*) [32])(auStack_160 + lVar73);
      auVar112._0_4_ = auVar266._0_4_ + auVar132._0_4_;
      auVar112._4_4_ = auVar266._4_4_ + auVar132._4_4_;
      auVar112._8_4_ = auVar266._8_4_ + auVar132._8_4_;
      auVar112._12_4_ = auVar266._12_4_ + auVar132._12_4_;
      auVar112._16_4_ = auVar266._16_4_ + auVar132._16_4_;
      auVar112._20_4_ = auVar266._20_4_ + auVar132._20_4_;
      auVar112._24_4_ = auVar266._24_4_ + auVar132._24_4_;
      auVar112._28_4_ = auVar266._28_4_ + auVar132._28_4_;
      uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar180._4_4_ = uVar76;
      auVar180._0_4_ = uVar76;
      auVar180._8_4_ = uVar76;
      auVar180._12_4_ = uVar76;
      auVar180._16_4_ = uVar76;
      auVar180._20_4_ = uVar76;
      auVar180._24_4_ = uVar76;
      auVar180._28_4_ = uVar76;
      auVar7 = vcmpps_avx(auVar112,auVar180,2);
      auVar113 = vandps_avx(auVar7,*(undefined1 (*) [32])(auStack_180 + lVar73));
      _local_760 = auVar113;
      auVar7 = *(undefined1 (*) [32])(auStack_180 + lVar73) & auVar7;
      if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar7 >> 0x7f,0) != '\0') ||
            (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar7 >> 0xbf,0) != '\0') ||
          (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar7[0x1f] < '\0')
      break;
      uVar72 = (ulong)(uVar70 - 1);
    }
    auVar154._8_4_ = 0x7f800000;
    auVar154._0_8_ = 0x7f8000007f800000;
    auVar154._12_4_ = 0x7f800000;
    auVar154._16_4_ = 0x7f800000;
    auVar154._20_4_ = 0x7f800000;
    auVar154._24_4_ = 0x7f800000;
    auVar154._28_4_ = 0x7f800000;
    auVar132 = vblendvps_avx(auVar154,auVar132,auVar113);
    auVar7 = vshufps_avx(auVar132,auVar132,0xb1);
    auVar7 = vminps_avx(auVar132,auVar7);
    auVar284 = vshufpd_avx(auVar7,auVar7,5);
    auVar7 = vminps_avx(auVar7,auVar284);
    auVar284 = vpermpd_avx2(auVar7,0x4e);
    auVar7 = vminps_avx(auVar7,auVar284);
    auVar132 = vcmpps_avx(auVar132,auVar7,0);
    auVar7 = auVar113 & auVar132;
    if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar7 >> 0x7f,0) != '\0') ||
          (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar7 >> 0xbf,0) != '\0') ||
        (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar7[0x1f] < '\0') {
      auVar113 = vandps_avx(auVar132,auVar113);
    }
    uVar74 = vmovmskps_avx(auVar113);
    iVar13 = 0;
    for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
      iVar13 = iVar13 + 1;
    }
    *(undefined4 *)(local_760 + (uint)(iVar13 << 2)) = 0;
    uVar14 = (&uStack_140)[uVar72 * 0xc];
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar14;
    local_be8 = aiStack_138[uVar72 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar73) = _local_760;
    uVar74 = uVar70 - 1;
    if ((((((((_local_760 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_760 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_760 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_760 >> 0x7f,0) != '\0') ||
          (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_760 >> 0xbf,0) != '\0') ||
        (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_760[0x1f] < '\0') {
      uVar74 = uVar70;
    }
    uVar76 = (undefined4)uVar14;
    auVar135._4_4_ = uVar76;
    auVar135._0_4_ = uVar76;
    auVar135._8_4_ = uVar76;
    auVar135._12_4_ = uVar76;
    auVar135._16_4_ = uVar76;
    auVar135._20_4_ = uVar76;
    auVar135._24_4_ = uVar76;
    auVar135._28_4_ = uVar76;
    auVar92 = vmovshdup_avx(auVar86);
    auVar92 = vsubps_avx(auVar92,auVar86);
    auVar114._0_4_ = auVar92._0_4_;
    auVar114._4_4_ = auVar114._0_4_;
    auVar114._8_4_ = auVar114._0_4_;
    auVar114._12_4_ = auVar114._0_4_;
    auVar114._16_4_ = auVar114._0_4_;
    auVar114._20_4_ = auVar114._0_4_;
    auVar114._24_4_ = auVar114._0_4_;
    auVar114._28_4_ = auVar114._0_4_;
    auVar92 = vfmadd132ps_fma(auVar114,auVar135,_DAT_01f7b040);
    local_420 = ZEXT1632(auVar92);
    local_5f0._8_8_ = 0;
    local_5f0._0_8_ = *(ulong *)(local_420 + (uint)(iVar13 << 2));
    uVar72 = (ulong)uVar74;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }